

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  short sVar17;
  short sVar18;
  _func_int *p_Var19;
  Layer *pLVar20;
  float fVar21;
  undefined8 uVar22;
  undefined4 uVar23;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  int *piVar31;
  size_t sVar32;
  Allocator *pAVar33;
  undefined1 auVar34 [32];
  undefined8 uVar35;
  void *pvVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  pointer pfVar39;
  pointer pfVar40;
  undefined1 auVar41 [32];
  byte bVar42;
  undefined1 uVar43;
  int i;
  uint uVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  Mat *this_00;
  ulong uVar48;
  _func_int **pp_Var49;
  int iVar50;
  uint uVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  float *pfVar61;
  int iVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  int iVar67;
  uint uVar68;
  int iVar69;
  int iVar70;
  char *pcVar71;
  int iVar72;
  long lVar73;
  float *pfVar74;
  int iVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  int iVar79;
  undefined1 *puVar80;
  _Vector_base<float,_std::allocator<float>_> *this_01;
  long lVar81;
  undefined8 *puVar82;
  int i_1;
  uint uVar83;
  long lVar84;
  undefined8 *puVar85;
  int n_9;
  long lVar86;
  undefined1 *puVar87;
  undefined1 *puVar88;
  int iVar89;
  int p_4;
  long lVar90;
  undefined1 *puVar91;
  ulong uVar92;
  void *pvVar93;
  float *pfVar94;
  ulong uVar95;
  uint uVar96;
  int iVar97;
  ulong uVar98;
  float *pfVar99;
  int q;
  int iVar100;
  bool bVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int local_798;
  long local_790;
  undefined1 local_778 [16];
  uint local_760;
  long local_758;
  long local_748;
  long local_740;
  undefined1 local_738 [16];
  undefined1 local_708 [16];
  undefined1 local_6e8 [16];
  Option opt_q;
  int sum0 [4];
  size_t local_648;
  int iStack_62c;
  Mat img;
  Mat kernel_tm;
  Mat bottom_blob_bordered;
  int sum1 [4];
  size_t local_4e8;
  int local_4cc;
  Mat top_blob_int32;
  vector<float,_std::allocator<float>_> requantize_scales;
  int local_40c;
  short t1 [4];
  int local_3e0;
  int local_3dc;
  size_t local_3d8;
  int local_3bc;
  int sum2 [4];
  size_t sStack_388;
  int iStack_36c;
  undefined1 local_378 [32];
  int sum3 [4];
  size_t local_338;
  int local_31c;
  short t0 [4];
  int local_2f0;
  int local_2ec;
  size_t local_2e8;
  int local_2cc;
  ulong local_2a8;
  int o0 [2];
  short w3 [4];
  size_t local_288;
  int local_26c;
  short w2 [4];
  size_t local_238;
  int local_21c;
  short t3 [4];
  undefined1 auStack_1f0 [24];
  short t2 [4];
  undefined1 auStack_1b0 [24];
  _Vector_base<float,_std::allocator<float>_> local_178;
  _Vector_base<float,_std::allocator<float>_> local_160;
  int sum3_2 [16];
  int sum2_2 [16];
  Mat bottom_blob_int8;
  Option opt_b;
  undefined4 uVar25;
  undefined3 uVar27;
  undefined2 uVar29;
  undefined1 auVar107 [16];
  
  iVar70 = bottom_blob->elempack;
  if (iVar70 == 0) {
    Mat::Mat(&bottom_blob_int8,bottom_blob);
LAB_00193257:
    uVar22._0_1_ = opt->lightmode;
    uVar22._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar22._4_4_ = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar23 = opt->openmp_blocktime;
    uVar24 = opt->use_winograd_convolution;
    uVar26 = opt->use_sgemm_convolution;
    uVar28 = opt->use_int8_inference;
    uVar30 = opt->use_vulkan_compute;
    uVar29 = CONCAT11(uVar30,uVar28);
    uVar27 = CONCAT21(uVar29,uVar26);
    uVar25 = CONCAT31(uVar27,uVar24);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q._0_4_ = SUB84(uVar22,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.num_threads = uVar22._4_4_;
    opt_q.openmp_blocktime = uVar23;
    opt_q._28_4_ = uVar25;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx[-3]),&opt_q)
    ;
  }
  else {
    sVar32 = bottom_blob->elemsize;
    Mat::Mat(&bottom_blob_int8,bottom_blob);
    if (((int)sVar32 << 3) / iVar70 != 8) goto LAB_00193257;
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx + (long)this->_vptr_Convolution_x86_avx[-3]),
             &bottom_blob_int8,&bottom_blob_bordered,opt);
  iVar69 = bottom_blob_bordered.c;
  iVar56 = bottom_blob_bordered.elempack;
  iVar70 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (bottom_blob_bordered.cstep * (long)bottom_blob_bordered.c == 0)) goto LAB_00195207;
  p_Var19 = this->_vptr_Convolution_x86_avx[-3];
  iVar67 = (~((*(int *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.w) /
           *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) + 1;
  iVar72 = (~((*(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var19) +
           1;
  bVar42 = (*(uint *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) & 3) == 0 &
           opt->use_packing_layout;
  uVar96 = (uint)bVar42 + (uint)bVar42 * 2 + 1;
  iVar79 = *(int *)(p_Var19 + 0x18 + (long)&(this->weight_data_int8).data);
  uVar68 = ((uint)bVar42 + (uint)bVar42 * 2) * 4 + 4;
  uVar63 = uVar68;
  if (100 < iVar79) {
    uVar63 = uVar96;
  }
  Mat::create(top_blob,iVar67,iVar72,
              (int)*(uint *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) /
              (int)uVar96,(ulong)uVar63,uVar96,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00195207;
  top_blob_int32.cstep = 0;
  top_blob_int32.data = (void *)0x0;
  top_blob_int32.refcount._0_4_ = 0;
  top_blob_int32.refcount._4_4_ = 0;
  top_blob_int32._16_12_ = SUB1612((undefined1  [16])0x0,4);
  top_blob_int32._32_12_ = SUB1612((undefined1  [16])0x0,0);
  top_blob_int32.w = 0;
  top_blob_int32.h = 0;
  top_blob_int32.d = 0;
  top_blob_int32.c = 0;
  Mat::create(&top_blob_int32,iVar67,iVar72,
              *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / (int)uVar96,(ulong)uVar68,
              uVar96,opt->workspace_allocator);
  iVar54 = top_blob_int32.c;
  iVar89 = top_blob_int32.h;
  iVar100 = top_blob_int32.w;
  iVar72 = bottom_blob_bordered.c;
  iVar67 = bottom_blob_bordered.w;
  iVar70 = -100;
  if ((top_blob_int32.data != (void *)0x0) && (top_blob_int32.cstep * (long)top_blob_int32.c != 0))
  {
    if (iVar56 == 8 && bVar42 == 1) {
      p_Var19 = this->_vptr_Convolution_x86_avx[-3];
      uVar68 = *(uint *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((uVar68 == 1) &&
         (*(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) {
        if ((*(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
           (((*(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1 ||
             (*(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var19) != 1)))) {
          if ((((*(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
               (*(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
              (*(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2)) ||
             (*(int *)((long)&this->convolution_dilation1 + (long)p_Var19) != 2)) goto LAB_001936ca;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,top_blob_int32.w,top_blob_int32.h,bottom_blob_bordered.c,
                      bottom_blob_bordered.elemsize,bottom_blob_bordered.elempack,
                      opt->workspace_allocator);
          iVar54 = 0;
          iVar70 = iVar100;
          if (iVar100 < 1) {
            iVar70 = iVar54;
          }
          local_708._0_8_ = &this->weight_data_int8;
          if (iVar89 < 1) {
            iVar89 = 0;
          }
          if (iVar72 < 1) {
            iVar72 = iVar54;
          }
          local_738._0_4_ = iVar72;
          for (; iVar54 != iVar72; iVar54 = iVar54 + 1) {
            Mat::channel(&img,&bottom_blob_bordered,iVar54);
            puVar82 = (undefined8 *)CONCAT44(img.data._4_4_,img.data._0_4_);
            Mat::~Mat(&img);
            Mat::channel(&img,(Mat *)&opt_q,iVar54);
            puVar85 = (undefined8 *)CONCAT44(img.data._4_4_,img.data._0_4_);
            Mat::~Mat(&img);
            for (iVar76 = 0; iVar50 = iVar70, iVar76 != iVar89; iVar76 = iVar76 + 1) {
              while (bVar101 = iVar50 != 0, iVar50 = iVar50 + -1, bVar101) {
                *puVar85 = *puVar82;
                puVar82 = puVar82 + 2;
                puVar85 = puVar85 + 1;
              }
              puVar82 = puVar82 + (iVar67 - iVar100) * 2;
            }
          }
          conv1x1s1_sgemm_pack8to4_int8_sse
                    ((Mat *)&opt_q,&top_blob_int32,&this->weight_data_int8,opt);
          goto LAB_00193ca5;
        }
        conv1x1s1_sgemm_pack8to4_int8_sse
                  (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,opt);
      }
      else {
LAB_001936ca:
        uVar63 = *(uint *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar70 = *(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        local_6e8._0_8_ = (long)iVar70;
        iVar76 = *(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_738._0_8_ = (long)iVar76;
        iVar50 = *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar46 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        lVar77 = (long)top_blob_int32.w;
        uVar98 = (ulong)(uint)top_blob_int32.h;
        if (opt->use_sgemm_convolution == true) {
          Mat::Mat((Mat *)&opt_q,top_blob_int32.h * top_blob_int32.w,uVar63 * uVar68,
                   bottom_blob_bordered.c,8,8,opt->workspace_allocator);
          uVar98 = 0;
          iVar54 = iVar100;
          if (iVar100 < 1) {
            iVar54 = 0;
          }
          if (iVar89 < 1) {
            iVar89 = 0;
          }
          uVar48 = (ulong)uVar68;
          if ((int)uVar68 < 1) {
            uVar48 = uVar98;
          }
          uVar92 = (ulong)uVar63;
          if ((int)uVar63 < 1) {
            uVar92 = uVar98;
          }
          uVar57 = (ulong)(uint)iVar72;
          if (iVar72 < 1) {
            uVar57 = uVar98;
          }
          while( true ) {
            iVar72 = (int)uVar98;
            if (iVar72 == (int)uVar57) break;
            Mat::channel(&img,&bottom_blob_bordered,iVar72);
            local_708._0_8_ = uVar98;
            Mat::channel(&kernel_tm,(Mat *)&opt_q,iVar72);
            puVar82 = (undefined8 *)kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            for (uVar98 = 0; uVar98 != uVar92; uVar98 = uVar98 + 1) {
              for (uVar64 = 0; uVar64 != uVar48; uVar64 = uVar64 + 1) {
                puVar85 = (undefined8 *)
                          (img.elemsize * (long)img.w * uVar98 * (long)iVar76 +
                           CONCAT44(img.data._4_4_,img.data._0_4_) + uVar64 * (long)iVar70 * 8);
                for (iVar55 = 0; iVar97 = iVar54, iVar55 != iVar89; iVar55 = iVar55 + 1) {
                  while (iVar97 != 0) {
                    *puVar82 = *puVar85;
                    puVar82 = puVar82 + 1;
                    puVar85 = puVar85 + iVar50;
                    iVar97 = iVar97 + -1;
                  }
                  puVar85 = puVar85 + ((long)(iVar67 * iVar46) - (long)(iVar50 * iVar100));
                }
              }
            }
            Mat::~Mat(&img);
            uVar98 = (ulong)(iVar72 + 1);
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&top_blob_int32,&this->weight_data_int8,opt);
LAB_00193ca5:
          Mat::~Mat((Mat *)&opt_q);
        }
        else {
          uVar83 = uVar63 * uVar68;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar83,
                     (allocator_type *)&opt_q);
          uVar44 = 0;
          uVar96 = uVar68;
          if ((int)uVar68 < 1) {
            uVar96 = uVar44;
          }
          if ((int)uVar63 < 1) {
            uVar63 = uVar44;
          }
          lVar90 = CONCAT44(img.data._4_4_,img.data._0_4_);
          iVar97 = 0;
          iVar55 = 0;
          uVar51 = uVar96;
          for (; uVar44 != uVar63; uVar44 = uVar44 + 1) {
            for (lVar84 = (long)iVar55; (int)uVar51 != lVar84; lVar84 = lVar84 + 1) {
              *(int *)(lVar90 + lVar84 * 4) = iVar97;
              iVar97 = iVar97 + iVar70;
            }
            iVar97 = iVar97 + (iVar67 * iVar76 - iVar70 * uVar68);
            uVar51 = uVar51 + uVar96;
            iVar55 = iVar55 + uVar96;
          }
          if ((int)uVar83 < 1) {
            uVar83 = 0;
          }
          if (iVar72 < 1) {
            iVar72 = 0;
          }
          uVar48 = 0;
          if (0 < iVar100) {
            uVar48 = (ulong)(uint)iVar100;
          }
          if (iVar89 < 1) {
            uVar98 = 0;
          }
          if (iVar54 < 1) {
            iVar54 = 0;
          }
          for (iVar70 = 0; iVar70 != iVar54; iVar70 = iVar70 + 1) {
            Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar70);
            local_758 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            for (uVar92 = 0; uVar92 != uVar98; uVar92 = uVar92 + 1) {
              for (uVar57 = 0; uVar57 != uVar48; uVar57 = uVar57 + 1) {
                Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar70);
                lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
                Mat::~Mat((Mat *)&opt_q);
                local_778 = (undefined1  [16])0x0;
                local_738 = (undefined1  [16])0x0;
                local_708 = (undefined1  [16])0x0;
                local_6e8 = (undefined1  [16])0x0;
                for (iVar67 = 0; iVar67 != iVar72; iVar67 = iVar67 + 1) {
                  Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar67);
                  for (lVar73 = 0; (ulong)uVar83 * 4 != lVar73; lVar73 = lVar73 + 4) {
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ =
                         *(ulong *)((long)(int)opt_q._44_4_ * uVar92 * (long)iVar46 *
                                    (long)opt_q.workspace_allocator +
                                    CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                    (long)(iVar50 * 8 * (int)uVar57) +
                                   (long)*(int *)(lVar90 + lVar73) * 8);
                    auVar107 = vpcmpgtb_avx((undefined1  [16])0x0,auVar105);
                    auVar119 = vpunpcklbw_avx(auVar105,auVar107);
                    auVar107 = *(undefined1 (*) [16])(lVar84 + lVar73 * 8);
                    auVar105 = *(undefined1 (*) [16])(lVar84 + 0x10 + lVar73 * 8);
                    auVar106 = vpcmpgtb_avx((undefined1  [16])0x0,auVar107);
                    auVar111 = vpcmpgtb_avx((undefined1  [16])0x0,auVar105);
                    auVar112 = vpunpcklbw_avx(auVar107,auVar106);
                    auVar107 = vpunpckhbw_avx(auVar107,auVar106);
                    auVar106 = vpunpcklbw_avx(auVar105,auVar111);
                    auVar105 = vpunpckhbw_avx(auVar105,auVar111);
                    auVar114 = vpmullw_avx(auVar119,auVar112);
                    auVar112 = vpmulhw_avx(auVar119,auVar112);
                    auVar120 = vpmullw_avx(auVar119,auVar107);
                    auVar118 = vpmulhw_avx(auVar119,auVar107);
                    auVar115 = vpmullw_avx(auVar119,auVar106);
                    auVar113 = vpmulhw_avx(auVar119,auVar106);
                    auVar121 = vpmullw_avx(auVar119,auVar105);
                    auVar119 = vpmulhw_avx(auVar119,auVar105);
                    auVar107 = vpunpcklwd_avx(auVar114,auVar112);
                    auVar107 = vpaddd_avx(auVar107,local_6e8);
                    auVar105 = vpunpcklwd_avx(auVar120,auVar118);
                    auVar105 = vpaddd_avx(auVar105,local_708);
                    auVar106 = vpunpcklwd_avx(auVar115,auVar113);
                    auVar106 = vpaddd_avx(auVar106,local_738);
                    auVar111 = vpunpcklwd_avx(auVar121,auVar119);
                    auVar111 = vpaddd_avx(auVar111,local_778);
                    auVar112 = vpunpckhwd_avx(auVar114,auVar112);
                    local_6e8 = vpaddd_avx(auVar107,auVar112);
                    auVar107 = vpunpckhwd_avx(auVar120,auVar118);
                    local_708 = vpaddd_avx(auVar105,auVar107);
                    auVar107 = vpunpckhwd_avx(auVar115,auVar113);
                    local_738 = vpaddd_avx(auVar106,auVar107);
                    auVar107 = vpunpckhwd_avx(auVar121,auVar119);
                    local_778 = vpaddd_avx(auVar111,auVar107);
                  }
                  lVar84 = lVar84 + (ulong)uVar83 * 0x20;
                  Mat::~Mat((Mat *)&opt_q);
                }
                auVar107 = vpunpckldq_avx(local_6e8,local_708);
                auVar111 = vpunpckldq_avx(local_738,local_778);
                auVar105 = vpunpckhdq_avx(local_6e8,local_708);
                auVar106 = vpunpckhdq_avx(local_738,local_778);
                auVar112 = vpunpcklqdq_avx(auVar107,auVar111);
                auVar107 = vpunpckhqdq_avx(auVar107,auVar111);
                auVar107 = vpaddd_avx(auVar112,auVar107);
                auVar111 = vpunpcklqdq_avx(auVar105,auVar106);
                auVar105 = vpunpckhqdq_avx(auVar105,auVar106);
                auVar105 = vpaddd_avx(auVar105,auVar111);
                auVar107 = vpaddd_avx(auVar107,auVar105);
                *(undefined1 (*) [16])(local_758 + uVar57 * 0x10) = auVar107;
              }
              local_758 = local_758 + lVar77 * 0x10;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&img);
        }
      }
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var49 = this->_vptr_Convolution_x86_avx;
      for (lVar77 = 0; p_Var19 = pp_Var49[-3],
          lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar77 = lVar77 + 1) {
        fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
        fVar110 = 0.0;
        if (fVar104 != 0.0) {
          fVar110 = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar110;
      }
      if (iVar79 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var19),opt);
        pLVar20 = this->activation;
        if (pLVar20 != (Layer *)0x0) {
          (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var19),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var19),
                   *(int *)(p_Var19 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var19 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar89 = top_blob_int32.c;
    iVar100 = top_blob_int32.h;
    iVar72 = top_blob_int32.w;
    iVar67 = bottom_blob_bordered.c;
    iVar70 = bottom_blob_bordered.w;
    if (iVar56 == 1 && bVar42 == 1) {
      p_Var19 = this->_vptr_Convolution_x86_avx[-3];
      iVar54 = *(int *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar76 = *(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar50 = *(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar46 = *(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar55 = *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar97 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
      lVar77 = (long)top_blob_int32.w;
      uVar98 = (ulong)(uint)top_blob_int32.h;
      uVar68 = iVar76 * iVar54;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar68,
                 (allocator_type *)&opt_q);
      iVar45 = 0;
      iVar53 = iVar54;
      if (iVar54 < 1) {
        iVar53 = iVar45;
      }
      if (iVar76 < 1) {
        iVar76 = iVar45;
      }
      lVar90 = CONCAT44(img.data._4_4_,img.data._0_4_);
      iVar62 = 0;
      iVar75 = 0;
      iVar52 = iVar53;
      for (; iVar45 != iVar76; iVar45 = iVar45 + 1) {
        for (lVar84 = (long)iVar75; iVar52 != lVar84; lVar84 = lVar84 + 1) {
          *(int *)(lVar90 + lVar84 * 4) = iVar62;
          iVar62 = iVar62 + iVar50;
        }
        iVar62 = iVar62 + (iVar70 * iVar46 - iVar50 * iVar54);
        iVar52 = iVar52 + iVar53;
        iVar75 = iVar75 + iVar53;
      }
      uVar92 = 0;
      uVar48 = (ulong)uVar68;
      if ((int)uVar68 < 1) {
        uVar48 = uVar92;
      }
      if (iVar67 < 1) {
        iVar67 = 0;
      }
      local_738._0_4_ = iVar67;
      uVar57 = 0;
      if (0 < iVar72) {
        uVar57 = (ulong)(uint)iVar72;
      }
      if (iVar100 < 1) {
        uVar98 = uVar92;
      }
      if (iVar89 < 1) {
        iVar89 = 0;
      }
      local_6e8._0_8_ = uVar48 * 4;
      while (iVar70 = (int)uVar92, iVar70 != iVar89) {
        Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar70);
        local_790 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
        Mat::~Mat((Mat *)&opt_q);
        for (uVar92 = 0; uVar92 != uVar98; uVar92 = uVar92 + 1) {
          lVar84 = uVar92 * (long)iVar97;
          local_708._0_8_ = lVar84;
          for (uVar64 = 0; uVar64 != uVar57; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar70);
            lVar73 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            local_778 = (undefined1  [16])0x0;
            for (iVar72 = 0; iVar72 != iVar67; iVar72 = iVar72 + 1) {
              Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar72);
              for (uVar58 = 0; uVar48 != uVar58; uVar58 = uVar58 + 1) {
                auVar107 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((int)opt_q._44_4_ * lVar84 *
                                                                     (long)opt_q.workspace_allocator
                                                                     + CONCAT44(opt_q.num_threads,
                                                                                opt_q._0_4_) +
                                                                     uVar64 * (long)iVar55 +
                                                                    (long)*(int *)(lVar90 + uVar58 *
                                                                                            4))),0);
                auVar106 = vpshufd_avx(auVar107,0);
                auVar111._8_8_ = 0;
                auVar111._0_8_ = *(ulong *)(lVar73 + uVar58 * 4);
                auVar107 = vpcmpgtb_avx((undefined1  [16])0x0,auVar111);
                auVar107 = vpunpcklbw_avx(auVar111,auVar107);
                auVar105 = vpmullw_avx(auVar106,auVar107);
                auVar107 = vpmulhw_avx(auVar106,auVar107);
                auVar107 = vpunpcklwd_avx(auVar105,auVar107);
                local_778 = vpaddd_avx(local_778,auVar107);
              }
              lVar73 = lVar73 + uVar48 * 4;
              Mat::~Mat((Mat *)&opt_q);
            }
            *(undefined1 (*) [16])(local_790 + uVar64 * 0x10) = local_778;
          }
          local_790 = local_790 + lVar77 * 0x10;
        }
        uVar92 = (ulong)(iVar70 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&img);
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var49 = this->_vptr_Convolution_x86_avx;
      for (lVar77 = 0; p_Var19 = pp_Var49[-3],
          lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar77 = lVar77 + 1) {
        fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
        fVar110 = 0.0;
        if (fVar104 != 0.0) {
          fVar110 = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar110;
      }
      if (iVar79 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var19),opt);
        pLVar20 = this->activation;
        if (pLVar20 != (Layer *)0x0) {
          (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var19),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var19),
                   *(int *)(p_Var19 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var19 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar89 = top_blob_int32.c;
    iVar100 = top_blob_int32.h;
    iVar72 = top_blob_int32.w;
    iVar67 = bottom_blob_bordered.c;
    iVar70 = bottom_blob_bordered.w;
    if ((iVar56 == 8) && (bVar42 != 1)) {
      p_Var19 = this->_vptr_Convolution_x86_avx[-3];
      iVar54 = *(int *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar76 = *(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar50 = *(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar46 = *(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar55 = *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar97 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
      lVar77 = (long)top_blob_int32.w;
      uVar98 = (ulong)(uint)top_blob_int32.h;
      uVar68 = iVar76 * iVar54;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar68,
                 (allocator_type *)&opt_q);
      iVar45 = 0;
      iVar53 = iVar54;
      if (iVar54 < 1) {
        iVar53 = iVar45;
      }
      if (iVar76 < 1) {
        iVar76 = iVar45;
      }
      lVar90 = CONCAT44(img.data._4_4_,img.data._0_4_);
      iVar62 = 0;
      iVar75 = 0;
      iVar52 = iVar53;
      for (; iVar45 != iVar76; iVar45 = iVar45 + 1) {
        for (lVar84 = (long)iVar75; iVar52 != lVar84; lVar84 = lVar84 + 1) {
          *(int *)(lVar90 + lVar84 * 4) = iVar62;
          iVar62 = iVar62 + iVar50;
        }
        iVar62 = iVar62 + (iVar70 * iVar46 - iVar50 * iVar54);
        iVar52 = iVar52 + iVar53;
        iVar75 = iVar75 + iVar53;
      }
      uVar92 = 0;
      uVar48 = (ulong)uVar68;
      if ((int)uVar68 < 1) {
        uVar48 = uVar92;
      }
      if (iVar67 < 1) {
        iVar67 = 0;
      }
      uVar57 = 0;
      if (0 < iVar72) {
        uVar57 = (ulong)(uint)iVar72;
      }
      if (iVar100 < 1) {
        uVar98 = uVar92;
      }
      if (iVar89 < 1) {
        iVar89 = 0;
      }
      local_6e8._0_8_ = uVar48 * 8;
      while (iVar70 = (int)uVar92, iVar70 != iVar89) {
        Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar70);
        local_790 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
        Mat::~Mat((Mat *)&opt_q);
        for (uVar92 = 0; uVar92 != uVar98; uVar92 = uVar92 + 1) {
          lVar84 = uVar92 * (long)iVar97;
          local_708._0_8_ = lVar84;
          for (uVar64 = 0; uVar64 != uVar57; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar70);
            lVar73 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            local_798 = (int)uVar64;
            lVar47 = (long)(iVar55 * 8 * local_798);
            local_738._0_8_ = lVar47;
            iVar72 = 0;
            for (iVar100 = 0; iVar100 != iVar67; iVar100 = iVar100 + 1) {
              Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar100);
              for (uVar58 = 0; uVar48 != uVar58; uVar58 = uVar58 + 1) {
                auVar106._8_8_ = 0;
                auVar106._0_8_ =
                     *(ulong *)((int)opt_q._44_4_ * lVar84 * (long)opt_q.workspace_allocator +
                                CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar47 +
                               (long)*(int *)(lVar90 + uVar58 * 4) * 8);
                auVar107 = vpcmpgtb_avx((undefined1  [16])0x0,auVar106);
                auVar106 = vpunpcklbw_avx(auVar106,auVar107);
                auVar112._8_8_ = 0;
                auVar112._0_8_ = *(ulong *)(lVar73 + uVar58 * 8);
                auVar107 = vpcmpgtb_avx((undefined1  [16])0x0,auVar112);
                auVar107 = vpunpcklbw_avx(auVar112,auVar107);
                auVar105 = vpmullw_avx(auVar107,auVar106);
                auVar107 = vpmulhw_avx(auVar106,auVar107);
                auVar106 = vpunpcklwd_avx(auVar105,auVar107);
                auVar107 = vpunpckhwd_avx(auVar105,auVar107);
                auVar107 = vpaddd_avx(auVar106,auVar107);
                auVar107 = vphaddd_avx(auVar107,auVar107);
                auVar107 = vphaddd_avx(auVar107,auVar107);
                iVar72 = iVar72 + auVar107._0_4_;
              }
              lVar73 = lVar73 + uVar48 * 8;
              Mat::~Mat((Mat *)&opt_q);
            }
            *(int *)(local_790 + uVar64 * 4) = iVar72;
          }
          local_790 = local_790 + lVar77 * 4;
        }
        uVar92 = (ulong)(iVar70 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&img);
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var49 = this->_vptr_Convolution_x86_avx;
      for (lVar77 = 0; p_Var19 = pp_Var49[-3],
          lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar77 = lVar77 + 1) {
        fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
        fVar110 = 0.0;
        if (fVar104 != 0.0) {
          fVar110 = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar110;
      }
      if (iVar79 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var19),opt);
        pLVar20 = this->activation;
        if (pLVar20 != (Layer *)0x0) {
          (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var19),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var19),
                   *(int *)(p_Var19 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var19 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar54 = top_blob_int32.c;
    iVar89 = top_blob_int32.h;
    iVar100 = top_blob_int32.w;
    iVar72 = bottom_blob_bordered.c;
    iVar67 = bottom_blob_bordered.w;
    auVar34 = (undefined1  [32])opt_q._32_32_;
    iVar70 = 0;
    if (bVar42 == 0 && iVar56 == 1) {
      pp_Var49 = this->_vptr_Convolution_x86_avx;
      if (((((opt->use_winograd_convolution == true) &&
            (p_Var19 = pp_Var49[-3],
            *(int *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
          ((*(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           (*(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         (((*(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           ((*(int *)((long)&this->convolution_dilation1 + (long)p_Var19) == 1 &&
            (0xf < iVar56 * iVar69)))) &&
          (0xf < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))) {
        lVar77 = (long)bottom_blob_bordered.c;
        piVar31 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,
                                  bottom_blob_bordered.refcount._0_4_);
        opt_q._0_4_ = SUB84(bottom_blob_bordered.data,0);
        opt_q.num_threads = (int)((ulong)bottom_blob_bordered.data >> 0x20);
        opt_q.blob_allocator._0_4_ = bottom_blob_bordered.refcount._0_4_;
        opt_q.blob_allocator._4_4_ = bottom_blob_bordered.refcount._4_4_;
        opt_q.workspace_allocator = (Allocator *)bottom_blob_bordered.elemsize;
        opt_q.openmp_blocktime = bottom_blob_bordered.elempack;
        opt_q.use_subgroup_shuffle = (bool)(undefined1)bottom_blob_bordered.w;
        opt_q.use_image_storage = (bool)bottom_blob_bordered.w._1_1_;
        opt_q.use_tensor_storage = (bool)bottom_blob_bordered.w._2_1_;
        opt_q.use_weight_fp16_storage = (bool)bottom_blob_bordered.w._3_1_;
        opt_q.use_shader_pack8 = (bool)(undefined1)bottom_blob_bordered.dims;
        opt_q.use_subgroup_basic = (bool)bottom_blob_bordered.dims._1_1_;
        opt_q.use_subgroup_vote = (bool)bottom_blob_bordered.dims._2_1_;
        opt_q.use_subgroup_ballot = (bool)bottom_blob_bordered.dims._3_1_;
        opt_q.use_local_pool_allocator = (bool)(undefined1)bottom_blob_bordered.d;
        opt_q.use_reserved_1 = (bool)bottom_blob_bordered.d._1_1_;
        opt_q.use_reserved_2 = (bool)bottom_blob_bordered.d._2_1_;
        opt_q.use_reserved_3 = (bool)bottom_blob_bordered.d._3_1_;
        opt_q.flush_denormals = bottom_blob_bordered.h;
        opt_q._32_8_ = bottom_blob_bordered.allocator;
        opt_q._60_4_ = auVar34._28_4_;
        opt_q.use_reserved_4 = (bool)(undefined1)bottom_blob_bordered.c;
        opt_q.use_reserved_5 = (bool)bottom_blob_bordered.c._1_1_;
        opt_q.use_reserved_6 = (bool)bottom_blob_bordered.c._2_1_;
        opt_q.use_reserved_7 = (bool)bottom_blob_bordered.c._3_1_;
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + 1;
          UNLOCK();
        }
        uVar68 = (top_blob_int32.w + 1) / 2;
        uVar98 = (long)(top_blob_int32.h + 1) / 2;
        iVar70 = (int)uVar98;
        iVar56 = uVar68 * 2 + 2;
        opt_b.lightmode = opt->lightmode;
        opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_b.num_threads = opt->num_threads;
        opt_b.workspace_allocator = opt->workspace_allocator;
        opt_b.openmp_blocktime = opt->openmp_blocktime;
        opt_b.use_winograd_convolution = opt->use_winograd_convolution;
        opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_b.use_int8_inference = opt->use_int8_inference;
        opt_b.use_vulkan_compute = opt->use_vulkan_compute;
        opt_b.use_bf16_storage = opt->use_bf16_storage;
        opt_b.use_fp16_packed = opt->use_fp16_packed;
        opt_b.use_fp16_storage = opt->use_fp16_storage;
        opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_b.use_int8_packed = opt->use_int8_packed;
        opt_b.use_int8_storage = opt->use_int8_storage;
        opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_b.use_packing_layout = opt->use_packing_layout;
        opt_b.use_shader_pack8 = opt->use_shader_pack8;
        opt_b.use_subgroup_basic = opt->use_subgroup_basic;
        opt_b.use_subgroup_vote = opt->use_subgroup_vote;
        opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_b.use_image_storage = opt->use_image_storage;
        opt_b.use_tensor_storage = opt->use_tensor_storage;
        opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
        opt_b.flush_denormals = opt->flush_denormals;
        opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_b.use_reserved_1 = opt->use_reserved_1;
        opt_b.use_reserved_2 = opt->use_reserved_2;
        opt_b.use_reserved_3 = opt->use_reserved_3;
        opt_b.use_reserved_4 = opt->use_reserved_4;
        opt_b.use_reserved_5 = opt->use_reserved_5;
        opt_b.use_reserved_6 = opt->use_reserved_6;
        opt_b.use_reserved_7 = opt->use_reserved_7;
        opt_b.use_reserved_8 = opt->use_reserved_8;
        opt_b.use_reserved_9 = opt->use_reserved_9;
        opt_b.use_reserved_10 = opt->use_reserved_10;
        opt_b.use_reserved_11 = opt->use_reserved_11;
        opt_b.blob_allocator = opt->workspace_allocator;
        copy_make_border(&bottom_blob_bordered,(Mat *)&opt_q,0,
                         (iVar70 * 2 - bottom_blob_bordered.h) + 2,0,iVar56 - bottom_blob_bordered.w
                         ,0,0.0,&opt_b);
        img.cstep = 0;
        img.data._0_4_ = 0;
        img.data._4_4_ = 0;
        img.refcount._0_4_ = 0;
        img.refcount._4_4_ = 0;
        img.elemsize = 0;
        img.elempack = 0;
        img._32_12_ = SUB1612((undefined1  [16])0x0,0);
        img.w = 0;
        img._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar96 = iVar70 * uVar68;
        Mat::create(&img,0x10,uVar96,iVar72,2,opt->workspace_allocator);
        lVar90 = (long)iVar56;
        iVar69 = 0;
        uVar63 = 0;
        if (0 < (int)uVar68) {
          uVar63 = uVar68;
        }
        this_00 = &this->weight_data_3x3_winograd23_int8;
        uVar98 = uVar98 & 0xffffffff;
        if (iVar70 < 1) {
          uVar98 = 0;
        }
        iVar67 = 0;
        if (0 < iVar72) {
          iVar67 = iVar72;
        }
        for (; iVar69 != iVar67; iVar69 = iVar69 + 1) {
          Mat::channel(&kernel_tm,(Mat *)&opt_q,iVar69);
          pvVar36 = kernel_tm.data;
          Mat::~Mat(&kernel_tm);
          Mat::channel(&kernel_tm,&img,iVar69);
          pvVar93 = kernel_tm.data;
          Mat::~Mat(&kernel_tm);
          for (uVar48 = 0; uVar48 != uVar98; uVar48 = uVar48 + 1) {
            lVar59 = (long)(iVar56 * 2 * (int)uVar48) + (long)pvVar36;
            lVar84 = lVar59 + lVar90;
            lVar73 = lVar84 + lVar90;
            lVar47 = lVar73 + lVar90;
            for (uVar83 = 0; uVar83 != uVar63; uVar83 = uVar83 + 1) {
              for (lVar86 = 0; lVar86 != 4; lVar86 = lVar86 + 1) {
                *(short *)((long)&kernel_tm.data + lVar86 * 2) = (short)*(char *)(lVar59 + lVar86);
                *(short *)((long)sum0 + lVar86 * 2) = (short)*(char *)(lVar84 + lVar86);
                *(short *)((long)&requantize_scales.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar86 * 2) =
                     (short)*(char *)(lVar73 + lVar86);
                *(short *)((long)sum1 + lVar86 * 2) = (short)*(char *)(lVar47 + lVar86);
              }
              for (lVar86 = 0; auVar41 = _t2, auVar34 = _t3, lVar86 != 8; lVar86 = lVar86 + 2) {
                sVar17 = *(short *)((long)&requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start + lVar86);
                *(short *)((long)sum2 + lVar86) =
                     *(short *)((long)&kernel_tm.data + lVar86) - sVar17;
                sVar18 = *(short *)((long)sum0 + lVar86);
                *(short *)((long)sum3 + lVar86) = sVar18 + sVar17;
                *(short *)((long)w2 + lVar86) = sVar17 - sVar18;
                *(short *)((long)w3 + lVar86) = *(short *)((long)sum1 + lVar86) - sVar18;
              }
              t0[0] = (short)sum2[0];
              t1[0] = sum2[0]._2_2_;
              t0[1] = (short)sum3[0];
              t1[1] = sum3[0]._2_2_;
              t2[1] = (short)sum3[1];
              t2[0] = (short)sum2[1];
              t3[1] = sum3[1]._2_2_;
              t3[0] = sum2[1]._2_2_;
              t0[2] = w2[0];
              t1[2] = w2[1];
              t2[2] = w2[2];
              t3[2] = w2[3];
              t0[3] = w3[0];
              t1[3] = w3[1];
              auStack_1b0 = auVar41._8_24_;
              t2[3] = w3[2];
              auStack_1f0 = auVar34._8_24_;
              t3[3] = w3[3];
              for (lVar86 = 0; lVar86 != 8; lVar86 = lVar86 + 2) {
                sVar17 = *(short *)((long)t2 + lVar86);
                *(short *)((long)&kernel_tm.data + lVar86) = *(short *)((long)t0 + lVar86) - sVar17;
                sVar18 = *(short *)((long)t1 + lVar86);
                *(short *)((long)sum0 + lVar86) = sVar18 + sVar17;
                *(short *)((long)&requantize_scales.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar86) = sVar17 - sVar18;
                *(short *)((long)sum1 + lVar86) = *(short *)((long)t3 + lVar86) - sVar18;
              }
              for (lVar86 = 0; lVar86 != 8; lVar86 = lVar86 + 2) {
                *(undefined2 *)((long)pvVar93 + lVar86) =
                     *(undefined2 *)((long)&kernel_tm.data + lVar86);
                *(undefined2 *)((long)pvVar93 + lVar86 + 8) = *(undefined2 *)((long)sum0 + lVar86);
                *(undefined2 *)((long)pvVar93 + lVar86 + 0x10) =
                     *(undefined2 *)
                      ((long)&requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar86);
                *(undefined2 *)((long)pvVar93 + lVar86 + 0x18) =
                     *(undefined2 *)((long)sum1 + lVar86);
              }
              lVar59 = lVar59 + 2;
              lVar84 = lVar84 + 2;
              lVar73 = lVar73 + 2;
              lVar47 = lVar47 + 2;
              pvVar93 = (void *)((long)pvVar93 + 0x20);
            }
          }
        }
        kernel_tm.cstep = 0;
        kernel_tm.data = (void *)0x0;
        kernel_tm.refcount._0_4_ = 0;
        kernel_tm.refcount._4_4_ = 0;
        kernel_tm._16_12_ = SUB1612((undefined1  [16])0x0,4);
        kernel_tm._32_12_ = SUB1612((undefined1  [16])0x0,0);
        kernel_tm.w = 0;
        kernel_tm._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::operator=((Mat *)&opt_q,&kernel_tm);
        Mat::~Mat(&kernel_tm);
        kernel_tm.cstep = 0;
        kernel_tm.data = (void *)0x0;
        kernel_tm.refcount._0_4_ = 0;
        kernel_tm.refcount._4_4_ = 0;
        kernel_tm._16_12_ = SUB1612((undefined1  [16])0x0,4);
        kernel_tm._32_12_ = SUB1612((undefined1  [16])0x0,0);
        kernel_tm.w = 0;
        kernel_tm._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create(&kernel_tm,0x10,uVar96,iVar54,4,opt->workspace_allocator);
        iVar56 = iVar54 >> 2;
        uVar83 = iVar54 & 0xfffffffc;
        uVar92 = 0;
        uVar48 = (ulong)uVar96;
        if ((int)uVar96 < 1) {
          uVar48 = uVar92;
        }
        if (iVar56 < 1) {
          iVar56 = 0;
        }
        while( true ) {
          iVar69 = (int)uVar92;
          if (iVar69 == iVar56) break;
          uVar96 = iVar69 * 4;
          Mat::channel((Mat *)sum0,&kernel_tm,uVar96);
          Mat::channel((Mat *)&requantize_scales,&kernel_tm,uVar96 | 1);
          Mat::channel((Mat *)sum1,&kernel_tm,uVar96 | 2);
          local_738._0_4_ = uVar96;
          Mat::channel((Mat *)sum2,&kernel_tm,uVar96 | 3);
          Mat::channel((Mat *)sum3,this_00,uVar96);
          Mat::channel((Mat *)w2,this_00,uVar96 | 1);
          Mat::channel((Mat *)w3,this_00,uVar96 | 2);
          Mat::channel((Mat *)t0,this_00,uVar96 | 3);
          for (uVar92 = 0;
              pfVar40 = requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage, uVar35 = sum1._0_8_,
              uVar22 = sum0._0_8_, uVar92 != uVar48; uVar92 = uVar92 + 1) {
            pfVar39 = requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar37 = sum2._0_8_;
            sVar32 = sStack_388;
            _t2 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            _t3 = _t2;
            sum2_2[8] = t2._0_4_;
            sum2_2[9] = t2._4_4_;
            sum2_2[10] = t2._8_4_;
            sum2_2[0xb] = t2._12_4_;
            sum2_2[0xc] = t2._16_4_;
            sum2_2[0xd] = t2._20_4_;
            sum2_2[0xe] = t2._24_4_;
            sum2_2[0xf] = t2._28_4_;
            sum2_2[0] = t2._0_4_;
            sum2_2[1] = t2._4_4_;
            sum2_2[2] = t2._8_4_;
            sum2_2[3] = t2._12_4_;
            sum2_2[4] = t2._16_4_;
            sum2_2[5] = t2._20_4_;
            sum2_2[6] = t2._24_4_;
            sum2_2[7] = t2._28_4_;
            sum3_2[8] = t2._0_4_;
            sum3_2[9] = t2._4_4_;
            sum3_2[10] = t2._8_4_;
            sum3_2[0xb] = t2._12_4_;
            sum3_2[0xc] = t2._16_4_;
            sum3_2[0xd] = t2._20_4_;
            sum3_2[0xe] = t2._24_4_;
            sum3_2[0xf] = t2._28_4_;
            sum3_2[0] = t2._0_4_;
            sum3_2[1] = t2._4_4_;
            sum3_2[2] = t2._8_4_;
            sum3_2[3] = t2._12_4_;
            sum3_2[4] = t2._16_4_;
            sum3_2[5] = t2._20_4_;
            sum3_2[6] = t2._24_4_;
            sum3_2[7] = t2._28_4_;
            uVar57 = 0;
            while( true ) {
              if (lVar77 <= (long)(uVar57 | 3)) break;
              uVar96 = (uint)uVar57;
              Mat::channel((Mat *)t1,&img,uVar96);
              lVar90 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              local_708._0_8_ = (long)local_3bc;
              Mat::~Mat((Mat *)t1);
              Mat::channel((Mat *)t1,&img,uVar96 | 1);
              local_6e8._0_8_ = local_3d8;
              lVar84 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              local_738._0_8_ = uVar57;
              Mat::channel((Mat *)t1,&img,uVar96 | 2);
              lVar73 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              Mat::channel((Mat *)t1,&img,uVar96 | 3);
              lVar47 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              lVar59 = CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0]))) +
                       local_2e8 * uVar57 * (long)local_2cc;
              lVar86 = CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0]))) +
                       local_288 * uVar57 * (long)local_26c;
              lVar66 = CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) +
                       local_238 * uVar57 * (long)local_21c;
              lVar78 = sum3._0_8_ + local_338 * uVar57 * (long)local_31c;
              for (lVar81 = 0; lVar81 != 0x20; lVar81 = lVar81 + 2) {
                iVar67 = (int)*(short *)(lVar90 + local_3d8 * uVar92 * (long)local_3bc + lVar81);
                iVar72 = (int)*(short *)(lVar84 + local_3d8 * uVar92 * (long)local_3bc + lVar81);
                iVar100 = (int)*(short *)(lVar73 + local_3d8 * uVar92 * (long)local_3bc + lVar81);
                iVar89 = (int)*(short *)(local_3d8 * uVar92 * (long)local_3bc + lVar47 + lVar81);
                *(int *)(t2 + lVar81) =
                     *(short *)(lVar78 + 0x60 + lVar81) * iVar89 +
                     *(short *)(lVar78 + 0x40 + lVar81) * iVar100 +
                     *(short *)(lVar78 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar78 + lVar81) * iVar67 + *(int *)(t2 + lVar81);
                *(int *)(t3 + lVar81) =
                     *(short *)(lVar66 + 0x60 + lVar81) * iVar89 +
                     *(short *)(lVar66 + 0x40 + lVar81) * iVar100 +
                     *(short *)(lVar66 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar66 + lVar81) * iVar67 + *(int *)(t3 + lVar81);
                *(int *)((long)sum2_2 + lVar81 * 2) =
                     *(short *)(lVar86 + 0x60 + lVar81) * iVar89 +
                     *(short *)(lVar86 + 0x40 + lVar81) * iVar100 +
                     *(short *)(lVar86 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar86 + lVar81) * iVar67 + *(int *)((long)sum2_2 + lVar81 * 2);
                *(int *)((long)sum3_2 + lVar81 * 2) =
                     *(short *)(lVar59 + 0x60 + lVar81) * iVar89 +
                     *(short *)(lVar59 + 0x40 + lVar81) * iVar100 +
                     *(short *)(lVar59 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar59 + lVar81) * iVar67 + *(int *)((long)sum3_2 + lVar81 * 2);
              }
              uVar57 = uVar57 + 4;
            }
            for (; (long)uVar57 < lVar77; uVar57 = uVar57 + 1) {
              Mat::channel((Mat *)t1,&img,(int)uVar57);
              lVar90 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              for (lVar84 = 0; lVar84 != 0x20; lVar84 = lVar84 + 2) {
                iVar67 = (int)*(short *)(local_3d8 * uVar92 * (long)local_3bc + lVar90 + lVar84);
                *(int *)(t2 + lVar84) =
                     *(int *)(t2 + lVar84) +
                     *(short *)(local_338 * uVar57 * (long)local_31c + sum3._0_8_ + lVar84) * iVar67
                ;
                *(int *)(t3 + lVar84) =
                     *(int *)(t3 + lVar84) +
                     *(short *)(local_238 * uVar57 * (long)local_21c +
                                CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) + lVar84) *
                     iVar67;
                piVar31 = (int *)((long)sum2_2 + lVar84 * 2);
                *piVar31 = *piVar31 +
                           *(short *)(local_288 * uVar57 * (long)local_26c +
                                      CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0]))) + lVar84
                                     ) * iVar67;
                piVar31 = (int *)((long)sum3_2 + lVar84 * 2);
                *piVar31 = *piVar31 +
                           *(short *)(local_2e8 * uVar57 * (long)local_2cc +
                                      CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0]))) + lVar84
                                     ) * iVar67;
              }
            }
            for (lVar90 = 0; lVar90 != 0x40; lVar90 = lVar90 + 4) {
              *(undefined4 *)(uVar22 + local_648 * uVar92 * (long)iStack_62c + lVar90) =
                   *(undefined4 *)((long)t2 + lVar90);
              *(undefined4 *)((long)pfVar39 + lVar90 + (long)pfVar40 * uVar92 * (long)local_40c) =
                   *(undefined4 *)((long)t3 + lVar90);
              *(undefined4 *)(uVar35 + local_4e8 * uVar92 * (long)local_4cc + lVar90) =
                   *(undefined4 *)((long)sum2_2 + lVar90);
              *(undefined4 *)(uVar37 + sVar32 * uVar92 * (long)iStack_36c + lVar90) =
                   *(undefined4 *)((long)sum3_2 + lVar90);
            }
          }
          Mat::~Mat((Mat *)t0);
          Mat::~Mat((Mat *)w3);
          Mat::~Mat((Mat *)w2);
          Mat::~Mat((Mat *)sum3);
          Mat::~Mat((Mat *)sum2);
          Mat::~Mat((Mat *)sum1);
          Mat::~Mat((Mat *)&requantize_scales);
          Mat::~Mat((Mat *)sum0);
          uVar92 = (ulong)(iVar69 + 1);
        }
        for (; (int)uVar83 < iVar54; uVar83 = uVar83 + 1) {
          Mat::channel((Mat *)sum0,&kernel_tm,uVar83);
          Mat::channel((Mat *)&requantize_scales,this_00,uVar83);
          for (uVar92 = 0; uVar22 = sum0._0_8_, uVar92 != uVar48; uVar92 = uVar92 + 1) {
            _sum2 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_738._0_8_ = 1;
            local_708._0_8_ = 2;
            local_6e8._0_8_ = 3;
            uVar57 = 0;
            while( true ) {
              if (lVar77 <= (long)(uVar57 | 3)) break;
              uVar96 = (uint)uVar57;
              Mat::channel((Mat *)sum1,&img,uVar96);
              uVar35 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar96 | 1);
              uVar37 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar96 | 2);
              uVar38 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar96 | 3);
              lVar73 = local_4e8 * uVar92 * (long)local_4cc + sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              lVar90 = (long)local_40c;
              for (lVar84 = 0; lVar84 != 0x20; lVar84 = lVar84 + 2) {
                *(int *)((long)sum2 + lVar84 * 2) =
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * local_6e8._0_8_ * lVar90) *
                     (int)*(short *)(lVar73 + lVar84) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * local_708._0_8_ * lVar90) *
                     (int)*(short *)(uVar38 + local_4e8 * uVar92 * (long)local_4cc + lVar84) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * local_738._0_8_ * lVar90) *
                     (int)*(short *)(uVar37 + local_4e8 * uVar92 * (long)local_4cc + lVar84) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * uVar57 * lVar90) *
                     (int)*(short *)(uVar35 + local_4e8 * uVar92 * (long)local_4cc + lVar84) +
                     *(int *)((long)sum2 + lVar84 * 2);
              }
              uVar57 = uVar57 + 4;
              local_6e8._0_8_ = local_6e8._0_8_ + 4;
              local_708._0_8_ = local_708._0_8_ + 4;
              local_738._0_8_ = local_738._0_8_ + 4;
            }
            for (; (long)uVar57 < lVar77; uVar57 = uVar57 + 1) {
              Mat::channel((Mat *)sum1,&img,(int)uVar57);
              lVar84 = local_4e8 * uVar92 * (long)local_4cc + sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              for (lVar90 = 0; lVar90 != 0x10; lVar90 = lVar90 + 1) {
                sum2[lVar90] = sum2[lVar90] +
                               (int)*(short *)((long)requantize_scales.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                              lVar90 * 2 +
                                              (long)requantize_scales.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              * uVar57 * (long)local_40c) *
                               (int)*(short *)(lVar84 + lVar90 * 2);
              }
            }
            for (lVar90 = 0; lVar90 != 0x10; lVar90 = lVar90 + 1) {
              *(int *)(uVar22 + local_648 * uVar92 * (long)iStack_62c + lVar90 * 4) = sum2[lVar90];
            }
          }
          Mat::~Mat((Mat *)&requantize_scales);
          Mat::~Mat((Mat *)sum0);
        }
        sum0[0] = 0;
        sum0[1] = 0;
        sum0[2] = 0;
        sum0[3] = 0;
        Mat::operator=(&img,(Mat *)sum0);
        Mat::~Mat((Mat *)sum0);
        sum0[0] = 0;
        sum0[1] = 0;
        sum0[2] = 0;
        sum0[3] = 0;
        Mat::create((Mat *)sum0,uVar68 * 2,iVar70 * 2,iVar54,4,opt->workspace_allocator);
        iVar70 = 0;
        if (iVar54 < 1) {
          iVar54 = 0;
        }
        for (; iVar70 != iVar54; iVar70 = iVar70 + 1) {
          Mat::channel((Mat *)&requantize_scales,&kernel_tm,iVar70);
          Mat::channel((Mat *)sum1,(Mat *)sum0,iVar70);
          lVar77 = 0;
          for (uVar48 = 0; uVar48 != uVar98; uVar48 = uVar48 + 1) {
            puVar82 = (undefined8 *)(uVar48 * 2 * (long)local_4cc * local_4e8 + sum1._0_8_);
            puVar85 = (undefined8 *)((uVar48 * 2 + 1) * (long)local_4cc * local_4e8 + sum1._0_8_);
            lVar90 = (long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * lVar77;
            for (uVar92 = 0; uVar92 != uVar63; uVar92 = uVar92 + 1) {
              lVar73 = local_40c * lVar90;
              for (lVar84 = 0; lVar84 != 0x10; lVar84 = lVar84 + 4) {
                *(undefined4 *)((long)sum2 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73);
                *(undefined4 *)((long)sum3 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73 + 0x10);
                *(undefined4 *)((long)w2 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73 + 0x20);
                *(undefined4 *)((long)w3 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73 + 0x30);
              }
              for (lVar84 = 0; auVar41 = _t2, auVar34 = _t3, lVar84 != 0x10; lVar84 = lVar84 + 4) {
                *(int *)((long)t0 + lVar84) =
                     *(int *)((long)sum2 + lVar84) + *(int *)((long)sum3 + lVar84) +
                     *(int *)((long)w2 + lVar84);
                *(int *)((long)t1 + lVar84) =
                     (*(int *)((long)sum3 + lVar84) - *(int *)((long)w2 + lVar84)) +
                     *(int *)((long)w3 + lVar84);
              }
              t2[1] = t0[1];
              t2[0] = t0[0];
              t3[1] = t0[3];
              t3[0] = t0[2];
              t2[3] = t1[1];
              t2[2] = t1[0];
              t3[3] = t1[3];
              t3[2] = t1[2];
              auStack_1b0 = auVar41._8_24_;
              auStack_1f0 = auVar34._8_24_;
              sum2_2[1] = local_3e0;
              sum2_2[0] = local_2f0;
              sum3_2[1] = local_3dc;
              sum3_2[0] = local_2ec;
              for (lVar84 = 0; lVar84 != 8; lVar84 = lVar84 + 4) {
                *(int *)((long)o0 + lVar84) =
                     *(int *)((long)t2 + lVar84) + *(int *)((long)t3 + lVar84) +
                     *(int *)((long)sum2_2 + lVar84);
                *(int *)((long)o0 + lVar84 + -8) =
                     (*(int *)((long)t3 + lVar84) - *(int *)((long)sum2_2 + lVar84)) +
                     *(int *)((long)sum3_2 + lVar84);
              }
              auVar108._8_8_ = 0;
              auVar108._0_4_ = o0[0];
              auVar108._4_4_ = o0[1];
              auVar107 = vpsrad_avx(auVar108,2);
              *puVar82 = auVar107._0_8_;
              auVar109._8_8_ = 0;
              auVar109._0_8_ = local_2a8;
              auVar107 = vpsrad_avx(auVar109,2);
              *puVar85 = auVar107._0_8_;
              puVar82 = puVar82 + 1;
              puVar85 = puVar85 + 1;
              lVar90 = lVar90 + (long)requantize_scales.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage;
            }
            lVar77 = lVar77 + (int)uVar68;
          }
          Mat::~Mat((Mat *)sum1);
          Mat::~Mat((Mat *)&requantize_scales);
        }
        copy_cut_border((Mat *)sum0,&top_blob_int32,0,-top_blob_int32.h,0,-top_blob_int32.w,opt);
        Mat::~Mat((Mat *)sum0);
        Mat::~Mat(&kernel_tm);
        Mat::~Mat(&img);
        Mat::~Mat((Mat *)&opt_q);
        Mat::Mat((Mat *)&opt_q,
                 *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                         (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var49 = this->_vptr_Convolution_x86_avx;
        for (lVar77 = 0; p_Var19 = pp_Var49[-3],
            lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
            lVar77 = lVar77 + 1) {
          fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
          fVar110 = 0.0;
          if (fVar104 != 0.0) {
            fVar110 = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
          }
          *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar110;
        }
        if (iVar79 < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,top_blob,(Mat *)&opt_q,
                     (Mat *)(&this->field_0x1a8 + (long)p_Var19),opt);
          pLVar20 = this->activation;
          if (pLVar20 != (Layer *)0x0) {
            (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,top_blob,(Mat *)&opt_q,
                     (Mat *)(&this->field_0x280 + (long)p_Var19),
                     (Mat *)(&this->field_0x1a8 + (long)p_Var19),
                     *(int *)(p_Var19 + 0x1c + (long)&(this->weight_data_int8).data),
                     (Mat *)(p_Var19 + 0x20 + (long)&(this->weight_data_int8).data),opt);
        }
LAB_001951ea:
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        p_Var19 = pp_Var49[-3];
        iVar70 = *(int *)(p_Var19 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        if ((((opt->use_sgemm_convolution != true) || (iVar70 != 1)) ||
            (iVar70 = 1,
            *(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
           (1 < *(uint *)(p_Var19 + 0x1c + (long)&(this->weight_data_int8).data))) {
          iVar56 = *(int *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar69 = *(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar76 = *(int *)(p_Var19 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar50 = *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar46 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
          lVar77 = (long)top_blob_int32.w;
          uVar48 = (ulong)(uint)top_blob_int32.h;
          uVar98 = (ulong)(uint)top_blob_int32.c;
          uVar68 = iVar69 * iVar56;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar68,
                     (allocator_type *)&opt_q);
          iVar97 = 0;
          iVar55 = iVar56;
          if (iVar56 < 1) {
            iVar55 = iVar97;
          }
          if (iVar69 < 1) {
            iVar69 = iVar97;
          }
          lVar90 = CONCAT44(img.data._4_4_,img.data._0_4_);
          iVar45 = 0;
          iVar53 = iVar55;
          for (iVar52 = 0; iVar52 != iVar69; iVar52 = iVar52 + 1) {
            for (lVar84 = (long)iVar45; iVar53 != lVar84; lVar84 = lVar84 + 1) {
              *(int *)(lVar90 + lVar84 * 4) = iVar97;
              iVar97 = iVar97 + iVar70;
            }
            iVar97 = iVar97 + (iVar67 * iVar76 - iVar70 * iVar56);
            iVar53 = iVar53 + iVar55;
            iVar45 = iVar45 + iVar55;
          }
          uVar57 = 0;
          uVar92 = (ulong)uVar68;
          if ((int)uVar68 < 1) {
            uVar92 = uVar57;
          }
          uVar64 = (ulong)(uint)iVar72;
          if (iVar72 < 1) {
            uVar64 = uVar57;
          }
          uVar58 = 0;
          if (0 < iVar100) {
            uVar58 = (ulong)(uint)iVar100;
          }
          if (iVar89 < 1) {
            uVar48 = uVar57;
          }
          if (iVar54 < 1) {
            uVar98 = uVar57;
          }
          for (uVar57 = 0; uVar57 != uVar98; uVar57 = uVar57 + 1) {
            Mat::channel((Mat *)&opt_q,&top_blob_int32,(int)uVar57);
            local_790 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            for (uVar65 = 0; uVar65 != uVar48; uVar65 = uVar65 + 1) {
              for (uVar95 = 0; uVar95 != uVar58; uVar95 = uVar95 + 1) {
                lVar84 = *(long *)(p_Var19 + 0x28 +
                                  (long)&(this->weight_data_3x3_winograd23_int8).data) +
                         (long)(int)(iVar72 * uVar68 * (int)uVar57);
                iVar70 = 0;
                for (iVar56 = 0; iVar56 != (int)uVar64; iVar56 = iVar56 + 1) {
                  Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar56);
                  for (uVar60 = 0; uVar92 != uVar60; uVar60 = uVar60 + 1) {
                    iVar70 = iVar70 + (int)*(char *)(lVar84 + uVar60) *
                                      (int)*(char *)((long)(int)opt_q._44_4_ * uVar65 * (long)iVar46
                                                     * (long)opt_q.workspace_allocator +
                                                     CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                                     uVar95 * (long)iVar50 +
                                                    (long)*(int *)(lVar90 + uVar60 * 4));
                  }
                  lVar84 = lVar84 + (int)uVar68;
                  Mat::~Mat((Mat *)&opt_q);
                }
                *(int *)(local_790 + uVar95 * 4) = iVar70;
              }
              local_790 = local_790 + lVar77 * 4;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&img);
          Mat::Mat((Mat *)&opt_q,
                   *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                           (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
          pp_Var49 = this->_vptr_Convolution_x86_avx;
          for (lVar77 = 0; p_Var19 = pp_Var49[-3],
              lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar77 = lVar77 + 1) {
            fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
            fVar110 = 0.0;
            if (fVar104 != 0.0) {
              fVar110 = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
            }
            *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar110;
          }
          if (iVar79 < 0x65) {
            dequantize_from_int32
                      (&top_blob_int32,top_blob,(Mat *)&opt_q,
                       (Mat *)(&this->field_0x1a8 + (long)p_Var19),opt);
            pLVar20 = this->activation;
            if (pLVar20 != (Layer *)0x0) {
              (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
            }
          }
          else {
            requantize_from_int32_to_int8
                      (&top_blob_int32,top_blob,(Mat *)&opt_q,
                       (Mat *)(&this->field_0x280 + (long)p_Var19),
                       (Mat *)(&this->field_0x1a8 + (long)p_Var19),
                       *(int *)(p_Var19 + 0x1c + (long)&(this->weight_data_int8).data),
                       (Mat *)(p_Var19 + 0x20 + (long)&(this->weight_data_int8).data),opt);
          }
          goto LAB_001951ea;
        }
        if (iVar79 < 0x65) {
          local_740 = 3;
          local_748 = 2;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          for (lVar77 = 0; p_Var19 = pp_Var49[-3],
              lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar77 = lVar77 + 1) {
            fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
            opt_q._0_4_ = 0.0;
            if (fVar104 != 0.0) {
              opt_q._0_4_ = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
            }
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&opt_q);
            pp_Var49 = this->_vptr_Convolution_x86_avx;
          }
          uVar68 = *(uint *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar70 = *(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar56 = *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar69 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_178,&requantize_scales);
          iVar89 = bottom_blob_bordered.c;
          iVar100 = bottom_blob_bordered.w;
          iVar79 = top_blob->w;
          iVar67 = top_blob->h;
          iVar72 = top_blob->c;
          uVar98 = (ulong)iVar72;
          lVar77 = *(long *)(p_Var19 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data);
          lVar90 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
          iVar54 = iVar70 * uVar68;
          iVar76 = bottom_blob_bordered.c * iVar54;
          uVar63 = iVar67 * iVar79;
          Mat::Mat((Mat *)&opt_q,iVar76,uVar63,1,opt->workspace_allocator);
          if ((int)uVar68 < 1) {
            uVar68 = 0;
          }
          if (iVar70 < 1) {
            iVar70 = 0;
          }
          iVar50 = 0;
          if (0 < iVar89) {
            iVar50 = iVar89;
          }
          lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
          if (iVar79 < 1) {
            iVar79 = 0;
          }
          iVar46 = 0;
          if (iVar67 < 1) {
            iVar67 = 0;
          }
          iVar97 = 0;
          for (iVar55 = 0; iVar55 != iVar67; iVar55 = iVar55 + 1) {
            iVar53 = iVar46;
            for (iVar45 = 0; iVar45 != iVar79; iVar45 = iVar45 + 1) {
              for (iVar52 = 0; iVar52 != iVar50; iVar52 = iVar52 + 1) {
                Mat::channel(&img,&bottom_blob_bordered,iVar52);
                lVar73 = CONCAT44(img.data._4_4_,img.data._0_4_);
                Mat::~Mat(&img);
                iVar75 = iVar53;
                for (iVar62 = 0; iVar62 != iVar70; iVar62 = iVar62 + 1) {
                  for (uVar48 = 0; uVar68 != uVar48; uVar48 = uVar48 + 1) {
                    *(undefined1 *)(iVar97 + lVar84 + uVar48) =
                         *(undefined1 *)(lVar73 + (iVar75 + (int)uVar48));
                  }
                  iVar97 = iVar97 + (int)uVar48;
                  iVar75 = iVar75 + iVar100;
                }
              }
              iVar53 = iVar53 + iVar56;
            }
            iVar46 = iVar46 + iVar69 * iVar100;
          }
          lVar84 = 1;
          Mat::Mat(&img,iVar54 * 4,iVar89,((int)uVar63 / 4) * -3 + uVar63,1,opt->workspace_allocator
                  );
          uVar92 = 0;
          uVar48 = (ulong)(uint)((int)uVar63 >> 2);
          if ((int)uVar63 >> 2 < 1) {
            uVar48 = uVar92;
          }
          for (uVar57 = 0; pAVar33 = opt_q.workspace_allocator, uVar57 != uVar48;
              uVar57 = uVar57 + 1) {
            lVar73 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar66 = (long)(int)opt_q._44_4_;
            Mat::channel(&kernel_tm,&img,(int)uVar57);
            pvVar36 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar47 = (long)pAVar33 * local_748 * lVar66 + lVar73;
            lVar59 = (long)pAVar33 * local_740 * lVar66 + lVar73;
            lVar86 = (long)pAVar33 * lVar84 * lVar66 + lVar73;
            lVar73 = (long)pAVar33 * uVar92 * lVar66 + lVar73;
            for (lVar66 = 0; (int)lVar66 + 1 < iVar76; lVar66 = lVar66 + 2) {
              *(undefined1 *)((long)pvVar36 + lVar66 * 4) = *(undefined1 *)(lVar73 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 1) = *(undefined1 *)(lVar73 + 1 + lVar66)
              ;
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 2) = *(undefined1 *)(lVar86 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 3) = *(undefined1 *)(lVar86 + 1 + lVar66)
              ;
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 4) = *(undefined1 *)(lVar47 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 5) = *(undefined1 *)(lVar47 + 1 + lVar66)
              ;
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 6) = *(undefined1 *)(lVar59 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 7) = *(undefined1 *)(lVar59 + 1 + lVar66)
              ;
            }
            for (; (int)lVar66 < iVar76; lVar66 = lVar66 + 1) {
              *(undefined1 *)((long)pvVar36 + lVar66 * 4) = *(undefined1 *)(lVar73 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 1) = *(undefined1 *)(lVar86 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 2) = *(undefined1 *)(lVar47 + lVar66);
              *(undefined1 *)((long)pvVar36 + lVar66 * 4 + 3) = *(undefined1 *)(lVar59 + lVar66);
            }
            local_748 = local_748 + 4;
            local_740 = local_740 + 4;
            lVar84 = lVar84 + 4;
            uVar92 = uVar92 + 4;
          }
          for (uVar48 = (ulong)(int)(uVar63 & 0xfffffffc); pAVar33 = opt_q.workspace_allocator,
              (long)uVar48 < (long)(int)uVar63; uVar48 = uVar48 + 1) {
            lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar73 = (long)(int)opt_q._44_4_;
            uVar92 = (ulong)(uint)((int)uVar48 >> 0x1f) << 0x20 | uVar48 & 0xffffffff;
            Mat::channel(&kernel_tm,&img,(int)((long)uVar92 % 4) + (int)((long)uVar92 / 4));
            pvVar36 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar84 = lVar84 + (long)pAVar33 * uVar48 * lVar73;
            for (lVar73 = 0; (int)lVar73 + 1 < iVar76; lVar73 = lVar73 + 2) {
              *(undefined1 *)((long)pvVar36 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
              *(undefined1 *)((long)pvVar36 + lVar73 + 1) = *(undefined1 *)(lVar84 + 1 + lVar73);
            }
            for (; (int)lVar73 < iVar76; lVar73 = lVar73 + 1) {
              *(undefined1 *)((long)pvVar36 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
            }
          }
          Mat::Mat(&kernel_tm,iVar54 * 4,iVar89,iVar72 / 4 + iVar72 % 4,1,opt->workspace_allocator);
          uVar92 = uVar98 & 0xfffffffffffffffc;
          uVar57 = 0;
          uVar48 = (ulong)(uint)(iVar72 >> 2);
          if (iVar72 >> 2 < 1) {
            uVar48 = uVar57;
          }
          iVar89 = iVar89 * iVar54;
          iVar69 = iVar89 * 4;
          iVar56 = iVar89 * 2;
          iVar70 = iVar89 * 3;
          local_738._0_4_ = iVar76;
          for (uVar64 = 0; uVar64 != uVar48; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar64);
            uVar22 = sum0._0_8_;
            lVar73 = (int)uVar57 + lVar77;
            lVar59 = (int)local_738._0_4_ + lVar77;
            lVar47 = iVar56 + lVar77;
            lVar86 = iVar70 + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar22 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar22 + 1 + lVar84 * 4) = *(undefined1 *)(lVar73 + 1 + lVar84);
              *(undefined1 *)(uVar22 + 2 + lVar84 * 4) = *(undefined1 *)(lVar59 + lVar84);
              *(undefined1 *)(uVar22 + 3 + lVar84 * 4) = *(undefined1 *)(lVar59 + 1 + lVar84);
              *(undefined1 *)(uVar22 + 4 + lVar84 * 4) = *(undefined1 *)(lVar47 + lVar84);
              *(undefined1 *)(uVar22 + 5 + lVar84 * 4) = *(undefined1 *)(lVar47 + 1 + lVar84);
              *(undefined1 *)(uVar22 + 6 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
              *(undefined1 *)(uVar22 + 7 + lVar84 * 4) = *(undefined1 *)(lVar86 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar22 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar22 + 1 + lVar84 * 4) = *(undefined1 *)(lVar59 + lVar84);
              *(undefined1 *)(uVar22 + 2 + lVar84 * 4) = *(undefined1 *)(lVar47 + lVar84);
              *(undefined1 *)(uVar22 + 3 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
            }
            uVar57 = (ulong)(uint)((int)uVar57 + iVar69);
            local_738._0_4_ = local_738._0_4_ + iVar69;
            iVar56 = iVar56 + iVar69;
            iVar70 = iVar70 + iVar69;
          }
          iVar70 = iVar89 * ((uint)(uVar98 >> 2) & 0x3fffffff) * 4;
          for (uVar57 = uVar92; (long)uVar57 < (long)uVar98; uVar57 = uVar57 + 1) {
            uVar64 = (ulong)(uint)((int)uVar57 >> 0x1f) << 0x20 | uVar57 & 0xffffffff;
            Mat::channel((Mat *)sum0,&kernel_tm,(int)((long)uVar64 % 4) + (int)((long)uVar64 / 4));
            uVar22 = sum0._0_8_;
            lVar73 = iVar70 + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar22 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar22 + 1 + lVar84) = *(undefined1 *)(lVar73 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar22 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
            }
            iVar70 = iVar70 + iVar76;
          }
          for (uVar57 = 0; uVar57 != uVar48; uVar57 = uVar57 + 1) {
            uVar64 = uVar57 * 4;
            if (lVar90 == 0) {
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar104 = 0.0;
              fVar110 = 0.0;
            }
            else {
              fVar104 = *(float *)(lVar90 + uVar57 * 0x10);
              fVar110 = *(float *)(lVar90 + 4 + uVar57 * 0x10);
              fVar103 = *(float *)(lVar90 + 8 + uVar57 * 0x10);
              fVar102 = *(float *)(lVar90 + 0xc + uVar57 * 0x10);
            }
            fVar1 = local_178._M_impl.super__Vector_impl_data._M_start[uVar57 * 4];
            fVar2 = local_178._M_impl.super__Vector_impl_data._M_start[uVar64 | 1];
            fVar3 = local_178._M_impl.super__Vector_impl_data._M_start[uVar64 | 2];
            fVar4 = local_178._M_impl.super__Vector_impl_data._M_start[uVar64 | 3];
            uVar68 = (uint)uVar64;
            Mat::channel((Mat *)sum0,top_blob,uVar68);
            pfVar99 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,uVar68 | 1);
            pfVar94 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,uVar68 | 2);
            pfVar74 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,(int)(uVar64 | 3));
            pfVar61 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            for (uVar68 = 0; (int)(uVar68 | 3) < (int)uVar63; uVar68 = uVar68 + 4) {
              Mat::channel((Mat *)sum0,&img,uVar68 >> 2);
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar57);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2 = (int  [4])ZEXT816(0);
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              for (uVar96 = 0; (int)(uVar96 | 1) < iVar76; uVar96 = uVar96 + 2) {
                cVar9 = *pcVar71;
                cVar10 = pcVar71[1];
                cVar11 = pcVar71[2];
                cVar12 = pcVar71[3];
                cVar13 = pcVar71[4];
                cVar14 = pcVar71[5];
                cVar15 = pcVar71[6];
                cVar16 = pcVar71[7];
                for (lVar84 = 0; lVar84 != 8; lVar84 = lVar84 + 2) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  iVar56 = (int)*(char *)(lVar77 + 1 + lVar84);
                  *(int *)((long)sum0 + lVar84 * 2) =
                       iVar56 * cVar10 + iVar70 * cVar9 + *(int *)((long)sum0 + lVar84 * 2);
                  piVar31 = (int *)((long)sum2 + lVar84 * 2);
                  *piVar31 = *piVar31 + iVar56 * cVar14 + iVar70 * cVar13;
                  *(int *)((long)sum1 + lVar84 * 2) =
                       iVar56 * cVar12 + iVar70 * cVar11 + *(int *)((long)sum1 + lVar84 * 2);
                  piVar31 = (int *)((long)sum3 + lVar84 * 2);
                  *piVar31 = *piVar31 + iVar56 * cVar16 + iVar70 * cVar15;
                }
                pcVar71 = pcVar71 + 8;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar96 < iVar76; uVar96 = uVar96 + 1) {
                cVar9 = *pcVar71;
                cVar10 = pcVar71[1];
                cVar11 = pcVar71[2];
                cVar12 = pcVar71[3];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  sum0[lVar84] = sum0[lVar84] + iVar70 * cVar9;
                  sum1[lVar84] = sum1[lVar84] + iVar70 * cVar10;
                  sum2[lVar84] = sum2[lVar84] + iVar70 * cVar11;
                  sum3[lVar84] = sum3[lVar84] + iVar70 * cVar12;
                }
                pcVar71 = pcVar71 + 4;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 0x10; lVar77 = lVar77 + 4) {
                *(float *)((long)pfVar99 + lVar77) =
                     fVar1 * (float)*(int *)((long)sum0 + lVar77) + fVar104;
                *(float *)((long)pfVar94 + lVar77) =
                     fVar2 * (float)*(int *)((long)sum1 + lVar77) + fVar110;
                *(float *)((long)pfVar74 + lVar77) =
                     fVar3 * (float)*(int *)((long)sum2 + lVar77) + fVar103;
                *(float *)((long)pfVar61 + lVar77) =
                     fVar4 * (float)*(int *)((long)sum3 + lVar77) + fVar102;
              }
              pfVar99 = pfVar99 + 4;
              pfVar94 = pfVar94 + 4;
              pfVar74 = pfVar74 + 4;
              pfVar61 = pfVar61 + 4;
            }
            for (; (int)uVar68 < (int)uVar63; uVar68 = uVar68 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar68 & 3) + (uVar68 >> 2));
              uVar22 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar57);
              uVar35 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar79 = 0;
              iVar69 = 0;
              iVar56 = 0;
              iVar70 = 0;
              pcVar71 = (char *)uVar35;
              for (lVar77 = 0; (int)lVar77 + 1 < iVar76; lVar77 = lVar77 + 2) {
                iVar67 = (int)*(char *)(uVar22 + lVar77);
                iVar72 = (int)*(char *)(uVar22 + 1 + lVar77);
                iVar79 = pcVar71[1] * iVar72 + *pcVar71 * iVar67 + iVar79;
                iVar69 = pcVar71[3] * iVar72 + pcVar71[2] * iVar67 + iVar69;
                iVar56 = pcVar71[5] * iVar72 + pcVar71[4] * iVar67 + iVar56;
                iVar70 = pcVar71[7] * iVar72 + pcVar71[6] * iVar67 + iVar70;
                pcVar71 = pcVar71 + 8;
              }
              for (; (int)lVar77 < iVar76; lVar77 = lVar77 + 1) {
                iVar67 = (int)*(char *)(uVar22 + lVar77);
                iVar79 = iVar79 + *(char *)(uVar35 + lVar77 * 4) * iVar67;
                iVar69 = iVar69 + *(char *)(uVar35 + 1 + lVar77 * 4) * iVar67;
                iVar56 = iVar56 + *(char *)(uVar35 + 2 + lVar77 * 4) * iVar67;
                iVar70 = iVar70 + *(char *)(uVar35 + 3 + lVar77 * 4) * iVar67;
              }
              *pfVar99 = fVar1 * (float)iVar79 + fVar104;
              *pfVar94 = fVar2 * (float)iVar69 + fVar110;
              *pfVar74 = fVar3 * (float)iVar56 + fVar103;
              *pfVar61 = fVar4 * (float)iVar70 + fVar102;
              pfVar99 = pfVar99 + 1;
              pfVar94 = pfVar94 + 1;
              pfVar74 = pfVar74 + 1;
              pfVar61 = pfVar61 + 1;
            }
          }
          iVar70 = 0;
          if (0 < iVar76) {
            iVar70 = iVar76;
          }
          for (; (long)uVar92 < (long)uVar98; uVar92 = uVar92 + 1) {
            iVar56 = (int)uVar92;
            Mat::channel((Mat *)sum0,top_blob,iVar56);
            pfVar99 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar90 == 0) {
              fVar104 = 0.0;
            }
            else {
              fVar104 = *(float *)(lVar90 + uVar92 * 4);
            }
            fVar110 = local_178._M_impl.super__Vector_impl_data._M_start[uVar92];
            iVar56 = (int)((long)((ulong)(uint)(iVar56 >> 0x1f) << 0x20 | uVar92 & 0xffffffff) / 4)
                     * -3 + iVar56;
            for (uVar48 = 0; (int)((uint)uVar48 | 3) < (int)uVar63;
                uVar48 = (ulong)((uint)uVar48 + 4)) {
              Mat::channel((Mat *)sum0,&img,(int)(uVar48 >> 2));
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar56);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar68 = 0; (int)(uVar68 | 1) < iVar76; uVar68 = uVar68 + 2) {
                cVar9 = *pcVar71;
                cVar10 = pcVar71[1];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = (int)*(char *)(lVar77 + 1 + lVar84 * 2) * (int)cVar10 +
                                 (int)*(char *)(lVar77 + lVar84 * 2) * (int)cVar9 + sum0[lVar84];
                }
                pcVar71 = pcVar71 + 2;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar68 < iVar76; uVar68 = uVar68 + 1) {
                cVar9 = *pcVar71;
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = sum0[lVar84] + (int)*(char *)(lVar77 + lVar84) * (int)cVar9;
                }
                pcVar71 = pcVar71 + 1;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 4; lVar77 = lVar77 + 1) {
                pfVar99[lVar77] = fVar110 * (float)sum0[lVar77] + fVar104;
              }
              pfVar99 = pfVar99 + 4;
            }
            while (uVar68 = (uint)uVar48, (int)uVar68 < (int)uVar63) {
              Mat::channel((Mat *)sum0,&img,(uVar68 & 3) + (int)(uVar48 >> 2));
              uVar22 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar56);
              uVar35 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar69 = 0;
              for (lVar77 = 0; iVar70 != (int)lVar77; lVar77 = lVar77 + 1) {
                iVar69 = iVar69 + (int)*(char *)(uVar22 + lVar77) * (int)*(char *)(uVar35 + lVar77);
              }
              *pfVar99 = fVar110 * (float)iVar69 + fVar104;
              pfVar99 = pfVar99 + 1;
              uVar48 = (ulong)(uVar68 + 1);
            }
          }
          Mat::~Mat(&kernel_tm);
          Mat::~Mat(&img);
          Mat::~Mat((Mat *)&opt_q);
          this_01 = &local_178;
        }
        else {
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (lVar77 = 0; p_Var19 = pp_Var49[-3],
              lVar77 < *(int *)(p_Var19 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar77 = lVar77 + 1) {
            fVar104 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var19) + lVar77 * 4);
            opt_q._0_4_ = 0.0;
            if (fVar104 != 0.0) {
              opt_q._0_4_ = 1.0 / (fVar104 * **(float **)(&this->field_0x238 + (long)p_Var19));
            }
            img.data._0_4_ = **(undefined4 **)(&this->field_0x280 + (long)p_Var19);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&opt_q);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&img);
            pp_Var49 = this->_vptr_Convolution_x86_avx;
          }
          uVar68 = *(uint *)(p_Var19 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar70 = *(int *)(p_Var19 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar56 = *(int *)(p_Var19 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar69 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_160,&requantize_scales);
          iVar89 = bottom_blob_bordered.c;
          iVar100 = bottom_blob_bordered.w;
          iVar79 = top_blob->w;
          iVar67 = top_blob->h;
          iVar72 = top_blob->c;
          uVar98 = (ulong)iVar72;
          lVar77 = *(long *)(p_Var19 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data);
          lVar90 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
          iVar54 = iVar70 * uVar68;
          iVar76 = bottom_blob_bordered.c * iVar54;
          uVar63 = iVar67 * iVar79;
          Mat::Mat((Mat *)&opt_q,iVar76,uVar63,1,opt->workspace_allocator);
          if ((int)uVar68 < 1) {
            uVar68 = 0;
          }
          if (iVar70 < 1) {
            iVar70 = 0;
          }
          iVar50 = 0;
          if (0 < iVar89) {
            iVar50 = iVar89;
          }
          lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
          if (iVar79 < 1) {
            iVar79 = 0;
          }
          iVar46 = 0;
          if (iVar67 < 1) {
            iVar67 = 0;
          }
          iVar97 = 0;
          for (iVar55 = 0; iVar55 != iVar67; iVar55 = iVar55 + 1) {
            iVar53 = iVar46;
            for (iVar45 = 0; iVar45 != iVar79; iVar45 = iVar45 + 1) {
              for (iVar52 = 0; iVar52 != iVar50; iVar52 = iVar52 + 1) {
                Mat::channel(&img,&bottom_blob_bordered,iVar52);
                lVar73 = CONCAT44(img.data._4_4_,img.data._0_4_);
                Mat::~Mat(&img);
                iVar75 = iVar53;
                for (iVar62 = 0; iVar62 != iVar70; iVar62 = iVar62 + 1) {
                  for (uVar48 = 0; uVar68 != uVar48; uVar48 = uVar48 + 1) {
                    *(undefined1 *)(iVar97 + lVar84 + uVar48) =
                         *(undefined1 *)(lVar73 + (iVar75 + (int)uVar48));
                  }
                  iVar97 = iVar97 + (int)uVar48;
                  iVar75 = iVar75 + iVar100;
                }
              }
              iVar53 = iVar53 + iVar56;
            }
            iVar46 = iVar46 + iVar69 * iVar100;
          }
          lVar84 = 1;
          Mat::Mat(&img,iVar54 * 4,iVar89,((int)uVar63 / 4) * -3 + uVar63,1,opt->workspace_allocator
                  );
          local_760 = uVar63 & 0xfffffffc;
          uVar92 = 0;
          uVar48 = (ulong)(uint)((int)uVar63 >> 2);
          if ((int)uVar63 >> 2 < 1) {
            uVar48 = uVar92;
          }
          lVar73 = 3;
          lVar47 = 2;
          for (uVar57 = 0; pAVar33 = opt_q.workspace_allocator, uVar57 != uVar48;
              uVar57 = uVar57 + 1) {
            lVar59 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar81 = (long)(int)opt_q._44_4_;
            Mat::channel(&kernel_tm,&img,(int)uVar57);
            pvVar36 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar86 = (long)pAVar33 * lVar73 * lVar81 + lVar59;
            lVar66 = (long)pAVar33 * lVar47 * lVar81 + lVar59;
            lVar78 = (long)pAVar33 * lVar84 * lVar81 + lVar59;
            lVar59 = (long)pAVar33 * uVar92 * lVar81 + lVar59;
            for (lVar81 = 0; (int)lVar81 + 1 < iVar76; lVar81 = lVar81 + 2) {
              *(undefined1 *)((long)pvVar36 + lVar81 * 4) = *(undefined1 *)(lVar59 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 1) = *(undefined1 *)(lVar59 + 1 + lVar81)
              ;
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 2) = *(undefined1 *)(lVar78 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 3) = *(undefined1 *)(lVar78 + 1 + lVar81)
              ;
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 4) = *(undefined1 *)(lVar66 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 5) = *(undefined1 *)(lVar66 + 1 + lVar81)
              ;
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 6) = *(undefined1 *)(lVar86 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 7) = *(undefined1 *)(lVar86 + 1 + lVar81)
              ;
            }
            for (; (int)lVar81 < iVar76; lVar81 = lVar81 + 1) {
              *(undefined1 *)((long)pvVar36 + lVar81 * 4) = *(undefined1 *)(lVar59 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 1) = *(undefined1 *)(lVar78 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 2) = *(undefined1 *)(lVar66 + lVar81);
              *(undefined1 *)((long)pvVar36 + lVar81 * 4 + 3) = *(undefined1 *)(lVar86 + lVar81);
            }
            lVar73 = lVar73 + 4;
            lVar47 = lVar47 + 4;
            lVar84 = lVar84 + 4;
            uVar92 = uVar92 + 4;
          }
          for (uVar48 = (ulong)(int)local_760; pAVar33 = opt_q.workspace_allocator,
              (long)uVar48 < (long)(int)uVar63; uVar48 = uVar48 + 1) {
            lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar73 = (long)(int)opt_q._44_4_;
            uVar92 = (ulong)(uint)((int)uVar48 >> 0x1f) << 0x20 | uVar48 & 0xffffffff;
            Mat::channel(&kernel_tm,&img,(int)((long)uVar92 % 4) + (int)((long)uVar92 / 4));
            pvVar36 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar84 = lVar84 + (long)pAVar33 * uVar48 * lVar73;
            for (lVar73 = 0; (int)lVar73 + 1 < iVar76; lVar73 = lVar73 + 2) {
              *(undefined1 *)((long)pvVar36 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
              *(undefined1 *)((long)pvVar36 + lVar73 + 1) = *(undefined1 *)(lVar84 + 1 + lVar73);
            }
            for (; (int)lVar73 < iVar76; lVar73 = lVar73 + 1) {
              *(undefined1 *)((long)pvVar36 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
            }
          }
          Mat::Mat(&kernel_tm,iVar54 * 4,iVar89,iVar72 / 4 + iVar72 % 4,1,opt->workspace_allocator);
          uVar92 = uVar98 & 0xfffffffffffffffc;
          uVar57 = 0;
          uVar48 = (ulong)(uint)(iVar72 >> 2);
          if (iVar72 >> 2 < 1) {
            uVar48 = uVar57;
          }
          iVar89 = iVar89 * iVar54;
          iVar56 = iVar89 * 4;
          local_738._0_4_ = iVar89 * 2;
          local_708._0_4_ = iVar89 * 3;
          iVar70 = iVar76;
          for (uVar64 = 0; uVar64 != uVar48; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar64);
            uVar22 = sum0._0_8_;
            lVar73 = (int)uVar57 + lVar77;
            lVar59 = iVar70 + lVar77;
            lVar47 = (int)local_738._0_4_ + lVar77;
            lVar86 = (int)local_708._0_4_ + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar22 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar22 + 1 + lVar84 * 4) = *(undefined1 *)(lVar73 + 1 + lVar84);
              *(undefined1 *)(uVar22 + 2 + lVar84 * 4) = *(undefined1 *)(lVar59 + lVar84);
              *(undefined1 *)(uVar22 + 3 + lVar84 * 4) = *(undefined1 *)(lVar59 + 1 + lVar84);
              *(undefined1 *)(uVar22 + 4 + lVar84 * 4) = *(undefined1 *)(lVar47 + lVar84);
              *(undefined1 *)(uVar22 + 5 + lVar84 * 4) = *(undefined1 *)(lVar47 + 1 + lVar84);
              *(undefined1 *)(uVar22 + 6 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
              *(undefined1 *)(uVar22 + 7 + lVar84 * 4) = *(undefined1 *)(lVar86 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar22 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar22 + 1 + lVar84 * 4) = *(undefined1 *)(lVar59 + lVar84);
              *(undefined1 *)(uVar22 + 2 + lVar84 * 4) = *(undefined1 *)(lVar47 + lVar84);
              *(undefined1 *)(uVar22 + 3 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
            }
            uVar57 = (ulong)(uint)((int)uVar57 + iVar56);
            iVar70 = iVar70 + iVar56;
            local_738._0_4_ = local_738._0_4_ + iVar56;
            local_708._0_4_ = local_708._0_4_ + iVar56;
          }
          iVar70 = iVar89 * ((uint)(uVar98 >> 2) & 0x3fffffff) * 4;
          for (uVar57 = uVar92; (long)uVar57 < (long)uVar98; uVar57 = uVar57 + 1) {
            uVar64 = (ulong)(uint)((int)uVar57 >> 0x1f) << 0x20 | uVar57 & 0xffffffff;
            Mat::channel((Mat *)sum0,&kernel_tm,(int)((long)uVar64 % 4) + (int)((long)uVar64 / 4));
            uVar22 = sum0._0_8_;
            lVar73 = iVar70 + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar22 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar22 + 1 + lVar84) = *(undefined1 *)(lVar73 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar22 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
            }
            iVar70 = iVar70 + iVar76;
          }
          for (uVar57 = 0; uVar57 != uVar48; uVar57 = uVar57 + 1) {
            uVar64 = uVar57 * 4;
            Mat::channel((Mat *)sum0,top_blob,(uint)uVar64);
            puVar91 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar58 = uVar64 | 1;
            Mat::channel((Mat *)sum0,top_blob,(int)uVar58);
            puVar87 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar65 = uVar64 | 2;
            Mat::channel((Mat *)sum0,top_blob,(int)uVar65);
            puVar88 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar95 = uVar64 | 3;
            Mat::channel((Mat *)sum0,top_blob,(uint)uVar64 | 3);
            puVar80 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar90 == 0) {
              fVar103 = 0.0;
              fVar104 = 0.0;
              fVar110 = 0.0;
              fVar102 = 0.0;
            }
            else {
              fVar104 = *(float *)(lVar90 + uVar57 * 0x10);
              fVar110 = *(float *)(lVar90 + uVar58 * 4);
              fVar103 = *(float *)(lVar90 + uVar65 * 4);
              fVar102 = *(float *)(lVar90 + uVar95 * 4);
            }
            fVar1 = local_160._M_impl.super__Vector_impl_data._M_start[uVar57 * 8];
            fVar2 = local_160._M_impl.super__Vector_impl_data._M_start[uVar57 * 8 + 1];
            fVar3 = local_160._M_impl.super__Vector_impl_data._M_start[uVar58 * 2];
            fVar4 = local_160._M_impl.super__Vector_impl_data._M_start[uVar58 * 2 + 1];
            fVar5 = local_160._M_impl.super__Vector_impl_data._M_start[uVar65 * 2];
            fVar6 = local_160._M_impl.super__Vector_impl_data._M_start[uVar65 * 2 + 1];
            fVar7 = local_160._M_impl.super__Vector_impl_data._M_start[uVar95 * 2];
            fVar8 = local_160._M_impl.super__Vector_impl_data._M_start[uVar95 * 2 + 1];
            uVar68 = 0;
            while( true ) {
              if ((int)uVar63 <= (int)(uVar68 | 3)) break;
              Mat::channel((Mat *)sum0,&img,uVar68 >> 2);
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar57);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2 = (int  [4])ZEXT816(0);
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              for (uVar96 = 0; (int)(uVar96 | 1) < iVar76; uVar96 = uVar96 + 2) {
                cVar9 = *pcVar71;
                cVar10 = pcVar71[1];
                cVar11 = pcVar71[2];
                cVar12 = pcVar71[3];
                cVar13 = pcVar71[4];
                cVar14 = pcVar71[5];
                cVar15 = pcVar71[6];
                cVar16 = pcVar71[7];
                for (lVar84 = 0; lVar84 != 8; lVar84 = lVar84 + 2) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  iVar56 = (int)*(char *)(lVar77 + 1 + lVar84);
                  *(int *)((long)sum0 + lVar84 * 2) =
                       iVar56 * cVar10 + iVar70 * cVar9 + *(int *)((long)sum0 + lVar84 * 2);
                  piVar31 = (int *)((long)sum2 + lVar84 * 2);
                  *piVar31 = *piVar31 + iVar56 * cVar14 + iVar70 * cVar13;
                  *(int *)((long)sum1 + lVar84 * 2) =
                       iVar56 * cVar12 + iVar70 * cVar11 + *(int *)((long)sum1 + lVar84 * 2);
                  piVar31 = (int *)((long)sum3 + lVar84 * 2);
                  *piVar31 = *piVar31 + iVar56 * cVar16 + iVar70 * cVar15;
                }
                pcVar71 = pcVar71 + 8;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar96 < iVar76; uVar96 = uVar96 + 1) {
                cVar9 = *pcVar71;
                cVar10 = pcVar71[1];
                cVar11 = pcVar71[2];
                cVar12 = pcVar71[3];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  sum0[lVar84] = sum0[lVar84] + iVar70 * cVar9;
                  sum1[lVar84] = sum1[lVar84] + iVar70 * cVar10;
                  sum2[lVar84] = sum2[lVar84] + iVar70 * cVar11;
                  sum3[lVar84] = sum3[lVar84] + iVar70 * cVar12;
                }
                pcVar71 = pcVar71 + 4;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 4; lVar77 = lVar77 + 1) {
                fVar21 = fVar2 * (fVar1 * (float)sum0[lVar77] + fVar104);
                auVar107._8_4_ = 0x80000000;
                auVar107._0_8_ = 0x8000000080000000;
                auVar107._12_4_ = 0x80000000;
                auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar107);
                auVar118._8_4_ = 0x3effffff;
                auVar118._0_8_ = 0x3effffff3effffff;
                auVar118._12_4_ = 0x3effffff;
                auVar107 = vorps_avx(auVar107,auVar118);
                auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
                auVar107 = vroundss_avx(auVar107,auVar107,0xb);
                iVar56 = -0x7f;
                iVar70 = (int)auVar107._0_4_;
                if ((int)auVar107._0_4_ < -0x7e) {
                  iVar70 = iVar56;
                }
                iVar69 = 0x7f;
                if (0x7e < iVar70) {
                  iVar70 = iVar69;
                }
                puVar91[lVar77] = (char)iVar70;
                fVar21 = fVar4 * (fVar3 * (float)sum1[lVar77] + fVar110);
                auVar113._8_4_ = 0x80000000;
                auVar113._0_8_ = 0x8000000080000000;
                auVar113._12_4_ = 0x80000000;
                auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar113);
                auVar119._8_4_ = 0x3effffff;
                auVar119._0_8_ = 0x3effffff3effffff;
                auVar119._12_4_ = 0x3effffff;
                auVar107 = vorps_avx(auVar107,auVar119);
                auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
                auVar107 = vroundss_avx(auVar107,auVar107,0xb);
                iVar70 = (int)auVar107._0_4_;
                if ((int)auVar107._0_4_ < -0x7e) {
                  iVar70 = iVar56;
                }
                if (0x7e < iVar70) {
                  iVar70 = iVar69;
                }
                puVar87[lVar77] = (char)iVar70;
                fVar21 = fVar6 * (fVar5 * (float)sum2[lVar77] + fVar103);
                auVar114._8_4_ = 0x80000000;
                auVar114._0_8_ = 0x8000000080000000;
                auVar114._12_4_ = 0x80000000;
                auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar114);
                auVar120._8_4_ = 0x3effffff;
                auVar120._0_8_ = 0x3effffff3effffff;
                auVar120._12_4_ = 0x3effffff;
                auVar107 = vorps_avx(auVar107,auVar120);
                auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
                auVar107 = vroundss_avx(auVar107,auVar107,0xb);
                iVar70 = (int)auVar107._0_4_;
                if ((int)auVar107._0_4_ < -0x7e) {
                  iVar70 = iVar56;
                }
                if (0x7e < iVar70) {
                  iVar70 = iVar69;
                }
                puVar88[lVar77] = (char)iVar70;
                fVar21 = fVar8 * (fVar7 * (float)sum3[lVar77] + fVar102);
                auVar115._8_4_ = 0x80000000;
                auVar115._0_8_ = 0x8000000080000000;
                auVar115._12_4_ = 0x80000000;
                auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar115);
                auVar121._8_4_ = 0x3effffff;
                auVar121._0_8_ = 0x3effffff3effffff;
                auVar121._12_4_ = 0x3effffff;
                auVar107 = vorps_avx(auVar107,auVar121);
                auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
                auVar107 = vroundss_avx(auVar107,auVar107,0xb);
                iVar70 = (int)auVar107._0_4_;
                if (iVar70 < -0x7e) {
                  iVar70 = -0x7f;
                }
                if (0x7e < iVar70) {
                  iVar70 = 0x7f;
                }
                puVar80[lVar77] = (char)iVar70;
              }
              puVar91 = puVar91 + 4;
              puVar87 = puVar87 + 4;
              puVar88 = puVar88 + 4;
              puVar80 = puVar80 + 4;
              uVar68 = uVar68 + 4;
            }
            for (; (int)uVar68 < (int)uVar63; uVar68 = uVar68 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar68 & 3) + (uVar68 >> 2));
              uVar22 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar57);
              uVar35 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar79 = 0;
              iVar69 = 0;
              iVar56 = 0;
              iVar70 = 0;
              pcVar71 = (char *)uVar35;
              for (lVar77 = 0; (int)lVar77 + 1 < iVar76; lVar77 = lVar77 + 2) {
                iVar67 = (int)*(char *)(uVar22 + lVar77);
                iVar72 = (int)*(char *)(uVar22 + 1 + lVar77);
                iVar79 = pcVar71[1] * iVar72 + *pcVar71 * iVar67 + iVar79;
                iVar69 = pcVar71[3] * iVar72 + pcVar71[2] * iVar67 + iVar69;
                iVar56 = pcVar71[5] * iVar72 + pcVar71[4] * iVar67 + iVar56;
                iVar70 = pcVar71[7] * iVar72 + pcVar71[6] * iVar67 + iVar70;
                pcVar71 = pcVar71 + 8;
              }
              for (; (int)lVar77 < iVar76; lVar77 = lVar77 + 1) {
                iVar67 = (int)*(char *)(uVar22 + lVar77);
                iVar79 = iVar79 + *(char *)(uVar35 + lVar77 * 4) * iVar67;
                iVar69 = iVar69 + *(char *)(uVar35 + 1 + lVar77 * 4) * iVar67;
                iVar56 = iVar56 + *(char *)(uVar35 + 2 + lVar77 * 4) * iVar67;
                iVar70 = iVar70 + *(char *)(uVar35 + 3 + lVar77 * 4) * iVar67;
              }
              fVar21 = (fVar1 * (float)iVar79 + fVar104) * fVar2;
              auVar122._8_4_ = 0x80000000;
              auVar122._0_8_ = 0x8000000080000000;
              auVar122._12_4_ = 0x80000000;
              auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar122);
              auVar125._8_4_ = 0x3effffff;
              auVar125._0_8_ = 0x3effffff3effffff;
              auVar125._12_4_ = 0x3effffff;
              auVar107 = vorps_avx(auVar107,auVar125);
              auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
              auVar107 = vroundss_avx(auVar107,auVar107,0xb);
              iVar67 = -0x7f;
              iVar79 = (int)auVar107._0_4_;
              if ((int)auVar107._0_4_ < -0x7e) {
                iVar79 = iVar67;
              }
              uVar43 = (undefined1)iVar79;
              if (0x7e < iVar79) {
                uVar43 = 0x7f;
              }
              fVar21 = fVar4 * (fVar3 * (float)iVar69 + fVar110);
              auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar122);
              auVar107 = vorps_avx(auVar107,auVar125);
              auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
              auVar107 = vroundss_avx(auVar107,auVar107,0xb);
              iVar69 = (int)auVar107._0_4_;
              if ((int)auVar107._0_4_ < -0x7e) {
                iVar69 = iVar67;
              }
              *puVar91 = uVar43;
              uVar43 = (undefined1)iVar69;
              if (0x7e < iVar69) {
                uVar43 = 0x7f;
              }
              fVar21 = fVar6 * (fVar5 * (float)iVar56 + fVar103);
              auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar122);
              auVar107 = vorps_avx(auVar107,auVar125);
              auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
              auVar107 = vroundss_avx(auVar107,auVar107,0xb);
              *puVar87 = uVar43;
              iVar56 = (int)auVar107._0_4_;
              if ((int)auVar107._0_4_ < -0x7e) {
                iVar56 = iVar67;
              }
              if (0x7e < iVar56) {
                iVar56 = 0x7f;
              }
              *puVar88 = (char)iVar56;
              fVar21 = fVar8 * (fVar7 * (float)iVar70 + fVar102);
              auVar107 = vandps_avx(ZEXT416((uint)fVar21),auVar122);
              auVar107 = vorps_avx(auVar107,auVar125);
              auVar107 = ZEXT416((uint)(fVar21 + auVar107._0_4_));
              auVar107 = vroundss_avx(auVar107,auVar107,0xb);
              iVar70 = (int)auVar107._0_4_;
              if (iVar70 < -0x7e) {
                iVar70 = -0x7f;
              }
              uVar43 = (undefined1)iVar70;
              if (0x7e < iVar70) {
                uVar43 = 0x7f;
              }
              *puVar80 = uVar43;
              puVar91 = puVar91 + 1;
              puVar87 = puVar87 + 1;
              puVar88 = puVar88 + 1;
              puVar80 = puVar80 + 1;
            }
          }
          iVar70 = 0;
          if (0 < iVar76) {
            iVar70 = iVar76;
          }
          for (; (long)uVar92 < (long)uVar98; uVar92 = uVar92 + 1) {
            iVar56 = (int)uVar92;
            Mat::channel((Mat *)sum0,top_blob,iVar56);
            puVar91 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar90 == 0) {
              fVar104 = 0.0;
            }
            else {
              fVar104 = *(float *)(lVar90 + uVar92 * 4);
            }
            fVar110 = local_160._M_impl.super__Vector_impl_data._M_start[uVar92 * 2];
            fVar103 = local_160._M_impl.super__Vector_impl_data._M_start[uVar92 * 2 + 1];
            iVar56 = (int)((long)((ulong)(uint)(iVar56 >> 0x1f) << 0x20 | uVar92 & 0xffffffff) / 4)
                     * -3 + iVar56;
            uVar48 = 0;
            while( true ) {
              if ((int)uVar63 <= (int)((uint)uVar48 | 3)) break;
              Mat::channel((Mat *)sum0,&img,(int)(uVar48 >> 2));
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar56);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar68 = 0; (int)(uVar68 | 1) < iVar76; uVar68 = uVar68 + 2) {
                cVar9 = *pcVar71;
                cVar10 = pcVar71[1];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = (int)*(char *)(lVar77 + 1 + lVar84 * 2) * (int)cVar10 +
                                 (int)*(char *)(lVar77 + lVar84 * 2) * (int)cVar9 + sum0[lVar84];
                }
                pcVar71 = pcVar71 + 2;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar68 < iVar76; uVar68 = uVar68 + 1) {
                cVar9 = *pcVar71;
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = sum0[lVar84] + (int)*(char *)(lVar77 + lVar84) * (int)cVar9;
                }
                pcVar71 = pcVar71 + 1;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 4; lVar77 = lVar77 + 1) {
                fVar102 = (fVar110 * (float)sum0[lVar77] + fVar104) * fVar103;
                auVar116._8_4_ = 0x80000000;
                auVar116._0_8_ = 0x8000000080000000;
                auVar116._12_4_ = 0x80000000;
                auVar107 = vandps_avx(ZEXT416((uint)fVar102),auVar116);
                auVar123._8_4_ = 0x3effffff;
                auVar123._0_8_ = 0x3effffff3effffff;
                auVar123._12_4_ = 0x3effffff;
                auVar107 = vorps_avx(auVar107,auVar123);
                auVar107 = ZEXT416((uint)(fVar102 + auVar107._0_4_));
                auVar107 = vroundss_avx(auVar107,auVar107,0xb);
                iVar69 = (int)auVar107._0_4_;
                if (iVar69 < -0x7e) {
                  iVar69 = -0x7f;
                }
                if (0x7e < iVar69) {
                  iVar69 = 0x7f;
                }
                puVar91[lVar77] = (char)iVar69;
              }
              puVar91 = puVar91 + 4;
              uVar48 = (ulong)((uint)uVar48 + 4);
            }
            while( true ) {
              uVar68 = (uint)uVar48;
              if ((int)uVar63 <= (int)uVar68) break;
              Mat::channel((Mat *)sum0,&img,(uVar68 & 3) + (int)(uVar48 >> 2));
              uVar22 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar56);
              uVar35 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar69 = 0;
              for (lVar77 = 0; iVar70 != (int)lVar77; lVar77 = lVar77 + 1) {
                iVar69 = iVar69 + (int)*(char *)(uVar22 + lVar77) * (int)*(char *)(uVar35 + lVar77);
              }
              fVar102 = (fVar110 * (float)iVar69 + fVar104) * fVar103;
              auVar117._8_4_ = 0x80000000;
              auVar117._0_8_ = 0x8000000080000000;
              auVar117._12_4_ = 0x80000000;
              auVar107 = vandps_avx(ZEXT416((uint)fVar102),auVar117);
              auVar124._8_4_ = 0x3effffff;
              auVar124._0_8_ = 0x3effffff3effffff;
              auVar124._12_4_ = 0x3effffff;
              auVar107 = vorps_avx(auVar107,auVar124);
              auVar107 = ZEXT416((uint)(fVar102 + auVar107._0_4_));
              auVar107 = vroundss_avx(auVar107,auVar107,0xb);
              iVar69 = (int)auVar107._0_4_;
              if (iVar69 < -0x7e) {
                iVar69 = -0x7f;
              }
              uVar43 = (undefined1)iVar69;
              if (0x7e < iVar69) {
                uVar43 = 0x7f;
              }
              *puVar91 = uVar43;
              puVar91 = puVar91 + 1;
              uVar48 = (ulong)(uVar68 + 1);
            }
          }
          Mat::~Mat(&kernel_tm);
          Mat::~Mat(&img);
          Mat::~Mat((Mat *)&opt_q);
          this_01 = &local_160;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_01);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
        pLVar20 = this->activation;
        if (pLVar20 != (Layer *)0x0) {
          (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
          iVar70 = 0;
          goto LAB_001951fa;
        }
      }
      iVar70 = 0;
    }
  }
LAB_001951fa:
  Mat::~Mat(&top_blob_int32);
LAB_00195207:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_int8);
  return iVar70;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}